

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O1

void __thiscall
amrex::MLABecLaplacian::Fsmooth
          (MLABecLaplacian *this,int amrlev,int mglev,MultiFab *sol,MultiFab *rhs,int redblack)

{
  size_t __n;
  int iVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  pointer pIVar7;
  pointer pVVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  size_t sVar16;
  int *piVar17;
  Long LVar18;
  int *piVar19;
  Long LVar20;
  int *piVar21;
  int *piVar22;
  Long LVar23;
  int *piVar24;
  Long LVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  double *pdVar29;
  Long LVar30;
  Long LVar31;
  double *pdVar32;
  Long LVar33;
  double *pdVar34;
  double *pdVar35;
  double *pdVar36;
  Long LVar37;
  double *pdVar38;
  Long LVar39;
  double *pdVar40;
  double *pdVar41;
  double *pdVar42;
  MLABecLaplacian *pMVar43;
  uint uVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  int iVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  double *pdVar64;
  long lVar65;
  long lVar66;
  double *pdVar67;
  uint uVar68;
  ulong uVar69;
  int iVar70;
  uint uVar71;
  int iVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  long lVar85;
  ulong uVar86;
  undefined4 in_register_0000008c;
  long lVar87;
  long lVar88;
  long lVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  long lVar93;
  long lVar94;
  int iVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  bool bVar109;
  bool bVar110;
  undefined4 uVar111;
  undefined4 uVar112;
  double dVar113;
  undefined1 auVar114 [16];
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  MFIter mfi;
  Array1D<double,_0,_31> u_ls;
  Array1D<double,_0,_31> r_ls;
  Array1D<double,_0,_31> a_ls;
  MFItInfo mfi_info;
  Array1D<double,_0,_31> c_ls;
  Array1D<double,_0,_31> b_ls;
  long local_1050;
  int *local_1048;
  int *local_1038;
  long local_1030;
  long local_1020;
  int *local_1018;
  int *local_1010;
  ulong local_1008;
  double *local_ff0;
  int *local_fe8;
  long local_fe0;
  long local_fd0;
  ulong local_fc8;
  long local_fc0;
  long local_f90;
  double *local_f88;
  double *local_f80;
  ulong local_f60;
  long local_f50;
  long local_f40;
  long local_f20;
  int *local_f08;
  long local_ee8;
  int local_ec4;
  long local_ec0;
  long local_ea0;
  ulong local_e98;
  ulong local_df0;
  Array4<double> local_d78;
  long local_d38;
  long local_d30;
  long local_d28;
  long local_d20;
  long local_d18;
  ulong local_d10;
  double *local_d08;
  ulong local_d00;
  undefined8 local_cf8;
  long local_cf0;
  size_t local_ce8;
  long local_ce0;
  long local_cd8;
  size_t local_cd0;
  long local_cc8;
  long local_cc0;
  long local_cb8;
  double *local_cb0;
  long local_ca8;
  long local_ca0;
  long local_c98;
  long local_c90;
  long local_c88;
  long local_c80;
  long local_c78;
  ulong local_c70;
  double *local_c68;
  double *local_c60;
  int *local_c58;
  double *local_c50;
  int *local_c48;
  double *local_c40;
  Real local_c38;
  Array4<const_int> local_c30;
  Array4<const_int> local_bf0;
  Array4<const_int> local_bb0;
  Array4<const_int> local_b70;
  Array4<const_int> local_b30;
  Box local_af0;
  Box local_ad4;
  Array4<const_double> local_ab8;
  Array4<const_int> local_a78;
  Array4<const_double> local_a38;
  Array4<const_double> local_9f8;
  Array4<const_double> local_9b8;
  Array4<const_double> local_978;
  Array4<const_double> local_938;
  Array4<const_double> local_8f8;
  Array4<const_double> local_8b8;
  Array4<const_double> local_878;
  Array4<const_double> local_838;
  FabArray<amrex::FArrayBox> *local_7f8;
  long local_7f0;
  long local_7e8;
  int local_7dc;
  uint local_7d8;
  int local_7d4;
  int local_7d0;
  int local_7cc;
  Array4<const_double> local_7c8;
  FabArray<amrex::FArrayBox> *local_788;
  FabArray<amrex::FArrayBox> *local_780;
  ulong local_778;
  MLABecLaplacian *local_770;
  FabArray<amrex::Mask> *local_768;
  FabArray<amrex::Mask> *local_760;
  FabArray<amrex::Mask> *local_758;
  FabArray<amrex::FArrayBox> *local_750;
  FabArray<amrex::FArrayBox> *local_748;
  FabArray<amrex::FArrayBox> *local_740;
  FabArray<amrex::FArrayBox> *local_738;
  FabArray<amrex::FArrayBox> *local_730;
  FabArray<amrex::FArrayBox> *local_728;
  FabArray<amrex::Mask> *local_720;
  FabArray<amrex::FArrayBox> *local_718;
  FabArray<amrex::Mask> *local_710;
  FabArray<amrex::FArrayBox> *local_708;
  FabArray<amrex::Mask> *local_700;
  long local_6f8;
  FabArray<amrex::FArrayBox> *local_6f0;
  double local_6e8;
  double dStack_6e0;
  double local_6d8;
  undefined8 uStack_6d0;
  double local_6c8;
  double dStack_6c0;
  undefined1 local_6b8 [16];
  MFIter local_6a8;
  double local_648 [32];
  double local_548 [32];
  Array4<const_int> local_448 [4];
  MFItInfo local_344;
  double adStack_330 [32];
  double local_230 [33];
  double adStack_128 [31];
  
  local_cf8 = CONCAT44(in_register_0000008c,redblack);
  bVar109 = true;
  if (0 < mglev && amrlev == 0) {
    pIVar7 = (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.mg_coarsen_ratio_vec.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar109 = false;
    if ((pIVar7[(ulong)(uint)mglev - 1].vect[0] == 2) &&
       (pIVar7[(ulong)(uint)mglev - 1].vect[1] == 2)) {
      bVar109 = pIVar7[(ulong)(uint)mglev - 1].vect[2] == 2;
    }
  }
  lVar100 = (long)amrlev;
  local_6f8 = lVar100 * 3;
  lVar65 = (long)mglev;
  local_7f8 = *(FabArray<amrex::FArrayBox> **)
               &(this->m_a_coeffs).
                super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar100].
                super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
  local_7f0 = lVar65;
  local_780 = &sol->super_FabArray<amrex::FArrayBox>;
  local_6f0 = &rhs->super_FabArray<amrex::FArrayBox>;
  if ((*(long *)local_7f8[lVar65].super_FabArrayBase.n_grow.vect != 0) ||
     (local_7f8[lVar65].super_FabArrayBase.n_grow.vect[2] != 0)) {
    Assert_host("acoef.nGrowVect() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLABecLaplacian.cpp"
                ,0x294,(char *)0x0);
  }
  lVar104 = local_7f0;
  local_788 = (FabArray<amrex::FArrayBox> *)
              (local_7f0 * 0x480 +
              *(long *)&(this->m_b_coeffs).
                        super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar100].
                        super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                        .
                        super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              );
  lVar47 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.m_undrrelxr.
                     super_vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar100].
                     super_vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>.
                     super__Vector_base<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>
  ;
  lVar82 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.m_maskvals.
                     super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar100].
                     super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                     .
                     super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
  ;
  uVar44 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])(this);
  lVar100 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                      super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                      .
                      super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar100].
                      super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar60 = lVar104 * 200;
  dVar115 = this->m_b_scalar;
  pdVar64 = (double *)(lVar100 + 0x20 + lVar60);
  dVar113 = *pdVar64;
  dVar122 = pdVar64[1];
  dVar119 = *(double *)(lVar100 + 0x30 + lVar60);
  local_c38 = this->m_a_scalar;
  local_344.num_streams = Gpu::Device::max_gpu_streams;
  local_344.do_tiling = true;
  local_344.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_344.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_344.tilesize.vect[2] = DAT_00753ec0;
  local_344.dynamic = true;
  local_344.device_sync = true;
  MFIter::MFIter(&local_6a8,&local_780->super_FabArrayBase,&local_344);
  if (local_6a8.currentIndex < local_6a8.endIndex) {
    local_7f8 = local_7f8 + lVar65;
    local_708 = local_788 + 1;
    local_718 = local_788 + 2;
    lVar104 = lVar104 * 0x900;
    local_720 = (FabArray<amrex::Mask> *)(lVar82 + lVar104);
    lVar65 = local_7f0 * 0x970;
    local_728 = (FabArray<amrex::FArrayBox> *)(lVar65 + lVar47 + 8);
    local_730 = (FabArray<amrex::FArrayBox> *)(lVar47 + 0x188 + lVar65);
    local_738 = (FabArray<amrex::FArrayBox> *)(lVar47 + 0x308 + lVar65);
    local_740 = (FabArray<amrex::FArrayBox> *)(lVar47 + 0x488 + lVar65);
    local_748 = (FabArray<amrex::FArrayBox> *)(lVar47 + 0x608 + lVar65);
    local_750 = (FabArray<amrex::FArrayBox> *)(lVar65 + lVar47 + 0x788);
    local_700 = local_720 + 1;
    local_710 = local_720 + 2;
    local_758 = (FabArray<amrex::Mask> *)(lVar82 + lVar104 + 0x480);
    local_760 = (FabArray<amrex::Mask> *)(lVar82 + 0x600 + lVar104);
    local_768 = (FabArray<amrex::Mask> *)(lVar82 + 0x780 + lVar104);
    dVar122 = dVar122 * dVar122;
    auVar120._8_8_ = dVar115;
    auVar120._0_8_ = dVar115;
    auVar121._8_4_ = SUB84(dVar122,0);
    auVar121._0_8_ = dVar113 * dVar113;
    auVar121._12_4_ = (int)((ulong)dVar122 >> 0x20);
    auVar121 = divpd(auVar120,auVar121);
    dVar115 = dVar115 / (dVar119 * dVar119);
    dVar122 = auVar121._8_8_;
    dVar119 = auVar121._0_8_;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = -(ulong)(dVar122 < dVar119);
    auVar9._8_4_ = (int)-(ulong)(dVar122 < 0.0);
    auVar9._0_8_ = -(ulong)(dVar122 < dVar115);
    auVar9._12_4_ = (int)(-(ulong)(dVar122 < 0.0) >> 0x20);
    local_778 = SUB168(auVar114 | auVar9,0);
    local_7dc = 1 - SUB164(auVar114 | auVar9,0);
    local_7d8 = -(uint)(dVar119 < dVar115 || dVar119 < dVar122);
    if ((local_7d8 & 1) == 0) {
      local_7dc = 0;
    }
    local_6c8 = -dVar122;
    dStack_6c0 = -dVar122;
    local_6d8 = -dVar115;
    uStack_6d0 = 0x8000000000000000;
    local_6b8._8_4_ = auVar121._8_4_;
    local_6b8._0_8_ = -dVar119;
    local_6b8._12_4_ = auVar121._12_4_ ^ 0x80000000;
    local_d00 = (ulong)uVar44;
    local_770 = this;
    local_6e8 = dVar115;
    dStack_6e0 = dVar115;
    do {
      pMVar43 = local_770;
      FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_b30,local_720,&local_6a8);
      FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_b70,local_700,&local_6a8);
      FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_bb0,local_710,&local_6a8);
      FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_bf0,local_758,&local_6a8);
      FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_c30,local_760,&local_6a8);
      FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_a78,local_768,&local_6a8);
      MFIter::tilebox(&local_ad4,&local_6a8);
      BATransformer::operator()
                (&local_af0,&((local_6a8.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_6a8.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_6a8.currentIndex] * 0x1c +
                        *(long *)&((((local_6a8.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d78,local_780,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_838,local_6f0,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_7c8,local_7f8,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_878,local_788,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_ab8,local_708,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_8b8,local_718,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_8f8,local_728,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_938,local_730,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_978,local_738,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_9b8,local_740,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_9f8,local_748,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_a38,local_750,&local_6a8);
      iVar91 = local_ad4.bigend.vect[2];
      iVar28 = local_ad4.bigend.vect[1];
      iVar27 = local_ad4.bigend.vect[0];
      iVar26 = local_ad4.smallend.vect[2];
      iVar70 = local_ad4.smallend.vect[1];
      iVar15 = local_ad4.smallend.vect[0];
      iVar11 = local_af0.bigend.vect[2];
      iVar95 = local_af0.bigend.vect[1];
      iVar14 = local_af0.bigend.vect[0];
      iVar12 = local_af0.smallend.vect[2];
      iVar13 = local_af0.smallend.vect[1];
      iVar1 = local_af0.smallend.vect[0];
      pVVar8 = (pMVar43->super_MLCellABecLap).m_overset_mask.
               super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)
          *(tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
           &(&(pVVar8->
              super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              ).
              super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)[local_6f8][local_7f0]._M_t ==
          (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)0x0) {
        if (bVar109) {
          if (0 < (int)uVar44) {
            lVar100 = (long)local_ad4.smallend.vect[0];
            lVar65 = lVar100 * 8;
            local_f50 = 0;
            local_f60 = 0;
            do {
              iVar1 = local_ad4.smallend.vect[2];
              iVar13 = local_ad4.smallend.vect[2] + local_ad4.smallend.vect[0] +
                       (int)local_cf8 + local_ad4.smallend.vect[1];
              iVar12 = local_ad4.smallend.vect[2] + -1;
              iVar14 = local_ad4.smallend.vect[2];
              if (local_ad4.smallend.vect[2] <= local_ad4.bigend.vect[2]) {
                do {
                  iVar14 = iVar14 + 1;
                  if (local_ad4.smallend.vect[1] <= local_ad4.bigend.vect[1]) {
                    lVar47 = (long)iVar1;
                    iVar15 = local_ad4.smallend.vect[1];
                    iVar11 = iVar13;
                    iVar95 = local_ad4.smallend.vect[1] + -1;
                    iVar70 = local_ad4.smallend.vect[1];
                    do {
                      iVar70 = iVar70 + 1;
                      if (local_ad4.smallend.vect[0] <= local_ad4.bigend.vect[0]) {
                        lVar78 = (long)iVar15;
                        lVar82 = local_878.nstride * local_f50 +
                                 (lVar78 - local_878.begin.y) * local_878.jstride * 8 +
                                 (lVar47 - local_878.begin.z) * local_878.kstride * 8 +
                                 (long)local_878.begin.x * -8 + lVar65;
                        lVar75 = (lVar47 - local_ab8.begin.z) * local_ab8.kstride;
                        lVar79 = (lVar78 - local_8b8.begin.y) * local_8b8.jstride;
                        lVar66 = local_d78.jstride * 8;
                        lVar101 = (lVar78 - local_d78.begin.y) * lVar66;
                        lVar105 = local_d78.kstride * 8;
                        lVar81 = (lVar47 - local_d78.begin.z) * lVar105;
                        lVar106 = local_d78.nstride * local_f50;
                        lVar60 = (long)local_d78.begin.x;
                        lVar104 = lVar81 + lVar101 + lVar106 + lVar60 * -8 + lVar65;
                        lVar61 = 0;
                        do {
                          if ((iVar11 + (int)lVar61 & 1U) == 0) {
                            uVar111 = 0;
                            uVar112 = 0;
                            dVar113 = 0.0;
                            if (((long)local_af0.smallend.vect[0] + -lVar100 == lVar61) &&
                               (0 < local_b30.p
                                    [(lVar78 - local_b30.begin.y) * local_b30.jstride +
                                     (long)(~local_b30.begin.x + local_af0.smallend.vect[0]) +
                                     (lVar47 - local_b30.begin.z) * local_b30.kstride])) {
                              dVar113 = local_8f8.p
                                        [(lVar78 - local_8f8.begin.y) * local_8f8.jstride +
                                         ((long)local_af0.smallend.vect[0] - (long)local_8f8.begin.x
                                         ) + (lVar47 - local_8f8.begin.z) * local_8f8.kstride +
                                             local_8f8.nstride * local_f60];
                            }
                            if ((local_af0.smallend.vect[1] == iVar15) &&
                               (0 < local_b70.p
                                    [lVar100 + (((lVar47 - local_b70.begin.z) * local_b70.kstride +
                                                (~local_b70.begin.y + local_af0.smallend.vect[1]) *
                                                local_b70.jstride + lVar61) -
                                               (long)local_b70.begin.x)])) {
                              uVar2 = *(undefined8 *)
                                       ((long)local_938.p +
                                       lVar61 * 8 +
                                       local_938.nstride * local_f50 +
                                       (lVar47 - local_938.begin.z) * local_938.kstride * 8 +
                                       (local_af0.smallend.vect[1] - local_938.begin.y) *
                                       local_938.jstride * 8 + (long)local_938.begin.x * -8 + lVar65
                                       );
                              uVar111 = (undefined4)uVar2;
                              uVar112 = (undefined4)((ulong)uVar2 >> 0x20);
                            }
                            dVar123 = 0.0;
                            dVar116 = 0.0;
                            if ((local_af0.smallend.vect[2] == iVar1) &&
                               (0 < local_bb0.p
                                    [lVar100 + (((lVar78 - local_bb0.begin.y) * local_bb0.jstride +
                                                (~local_bb0.begin.z + local_af0.smallend.vect[2]) *
                                                local_bb0.kstride + lVar61) -
                                               (long)local_bb0.begin.x)])) {
                              dVar116 = *(double *)
                                         ((long)local_978.p +
                                         lVar61 * 8 +
                                         local_978.nstride * local_f50 +
                                         (lVar78 - local_978.begin.y) * local_978.jstride * 8 +
                                         (local_af0.smallend.vect[2] - local_978.begin.z) *
                                         local_978.kstride * 8 + (long)local_978.begin.x * -8 +
                                         lVar65);
                            }
                            if (((long)local_af0.bigend.vect[0] + -lVar100 == lVar61) &&
                               (0 < local_bf0.p
                                    [(lVar78 - local_bf0.begin.y) * local_bf0.jstride +
                                     (long)((local_af0.bigend.vect[0] - local_bf0.begin.x) + 1) +
                                     (lVar47 - local_bf0.begin.z) * local_bf0.kstride])) {
                              dVar123 = local_9b8.p
                                        [(lVar78 - local_9b8.begin.y) * local_9b8.jstride +
                                         ((long)local_af0.bigend.vect[0] - (long)local_9b8.begin.x)
                                         + (lVar47 - local_9b8.begin.z) * local_9b8.kstride +
                                           local_9b8.nstride * local_f60];
                            }
                            dVar127 = 0.0;
                            dVar128 = 0.0;
                            if ((local_af0.bigend.vect[1] == iVar15) &&
                               (0 < local_c30.p
                                    [lVar100 + (((lVar47 - local_c30.begin.z) * local_c30.kstride +
                                                ((local_af0.bigend.vect[1] - local_c30.begin.y) + 1)
                                                * local_c30.jstride + lVar61) -
                                               (long)local_c30.begin.x)])) {
                              dVar128 = *(double *)
                                         ((long)local_9f8.p +
                                         lVar61 * 8 +
                                         local_9f8.nstride * local_f50 +
                                         (lVar47 - local_9f8.begin.z) * local_9f8.kstride * 8 +
                                         (local_af0.bigend.vect[1] - local_9f8.begin.y) *
                                         local_9f8.jstride * 8 + (long)local_9f8.begin.x * -8 +
                                         lVar65);
                            }
                            if ((local_af0.bigend.vect[2] == iVar1) &&
                               (0 < local_a78.p
                                    [lVar100 + (((lVar78 - local_a78.begin.y) * local_a78.jstride +
                                                ((local_af0.bigend.vect[2] - local_a78.begin.z) + 1)
                                                * local_a78.kstride + lVar61) -
                                               (long)local_a78.begin.x)])) {
                              dVar127 = *(double *)
                                         ((long)local_a38.p +
                                         lVar61 * 8 +
                                         local_a38.nstride * local_f50 +
                                         (lVar78 - local_a38.begin.y) * local_a38.jstride * 8 +
                                         (local_af0.bigend.vect[2] - local_a38.begin.z) *
                                         local_a38.kstride * 8 + (long)local_a38.begin.x * -8 +
                                         lVar65);
                            }
                            dVar3 = *(double *)((long)local_878.p + lVar61 * 8 + lVar82);
                            dVar4 = *(double *)((long)local_878.p + lVar61 * 8 + lVar82 + 8);
                            dVar117 = *(double *)
                                       ((long)local_ab8.p +
                                       lVar61 * 8 +
                                       (lVar78 - local_ab8.begin.y) * local_ab8.jstride * 8 +
                                       lVar75 * 8 + local_ab8.nstride * local_f50 +
                                       (long)local_ab8.begin.x * -8 + lVar65);
                            dVar124 = *(double *)
                                       ((long)local_ab8.p +
                                       lVar61 * 8 +
                                       ((long)iVar70 - (long)local_ab8.begin.y) *
                                       local_ab8.jstride * 8 + lVar75 * 8 +
                                       local_ab8.nstride * local_f50 + (long)local_ab8.begin.x * -8
                                       + lVar65);
                            dVar131 = *(double *)
                                       ((long)local_8b8.p +
                                       lVar61 * 8 +
                                       (lVar47 - local_8b8.begin.z) * local_8b8.kstride * 8 +
                                       lVar79 * 8 + local_8b8.nstride * local_f50 +
                                       (long)local_8b8.begin.x * -8 + lVar65);
                            dVar125 = *(double *)
                                       ((long)local_8b8.p +
                                       lVar61 * 8 +
                                       ((long)iVar14 - (long)local_8b8.begin.z) *
                                       local_8b8.kstride * 8 + lVar79 * 8 +
                                       local_8b8.nstride * local_f50 + (long)local_8b8.begin.x * -8
                                       + lVar65);
                            dVar118 = (dVar131 + dVar125) * dStack_6e0 +
                                      (dVar117 + dVar124) * dVar122 +
                                      local_7c8.p
                                      [lVar100 + (((lVar47 - local_7c8.begin.z) * local_7c8.kstride
                                                  + (lVar78 - local_7c8.begin.y) * local_7c8.jstride
                                                    + lVar61) - (long)local_7c8.begin.x)] *
                                      local_c38 + (dVar3 + dVar4) * dVar119;
                            dVar126 = *(double *)((long)local_d78.p + lVar61 * 8 + lVar104);
                            *(double *)((long)local_d78.p + lVar61 * 8 + lVar104) =
                                 (1.15 / (dVar118 -
                                         ((dVar116 * dVar131 + dVar127 * dVar125) * local_6e8 +
                                         (dVar113 * dVar3 + dVar123 * dVar4) * dVar119 +
                                         ((double)CONCAT44(uVar112,uVar111) * dVar117 +
                                         dVar128 * dVar124) * dVar122))) *
                                 (*(double *)
                                   ((long)local_838.p +
                                   lVar61 * 8 +
                                   local_838.nstride * local_f50 +
                                   (lVar78 - local_838.begin.y) * local_838.jstride * 8 +
                                   (lVar47 - local_838.begin.z) * local_838.kstride * 8 +
                                   (long)local_838.begin.x * -8 + lVar65) -
                                 (dVar118 * dVar126 -
                                 ((dVar131 * *(double *)
                                              ((long)local_d78.p +
                                              lVar61 * 8 +
                                              lVar106 + lVar101 +
                                              (iVar12 - local_d78.begin.z) * lVar105 + lVar60 * -8 +
                                              lVar65) +
                                  dVar125 * *(double *)
                                             ((long)local_d78.p +
                                             lVar61 * 8 +
                                             ((long)iVar14 - (long)local_d78.begin.z) * lVar105 +
                                             lVar101 + lVar106 + lVar60 * -8 + lVar65)) * dVar115 +
                                 (dVar3 * local_d78.p
                                          [(iVar15 - local_d78.begin.y) * local_d78.jstride +
                                           (iVar1 - local_d78.begin.z) * local_d78.kstride +
                                           local_d78.nstride * local_f60 +
                                           (long)(((local_ad4.smallend.vect[0] + -1) -
                                                  local_d78.begin.x) + (int)lVar61)] +
                                 dVar4 * *(double *)((long)local_d78.p + lVar61 * 8 + lVar104 + 8))
                                 * dVar119 +
                                 (dVar117 * *(double *)
                                             ((long)local_d78.p +
                                             lVar61 * 8 +
                                             lVar81 + lVar106 +
                                             (iVar95 - local_d78.begin.y) * lVar66 + lVar60 * -8 +
                                             lVar65) +
                                 dVar124 * *(double *)
                                            ((long)local_d78.p +
                                            lVar61 * 8 +
                                            ((long)iVar70 - (long)local_d78.begin.y) * lVar66 +
                                            lVar81 + lVar106 + lVar60 * -8 + lVar65)) * dVar122))) +
                                 dVar126;
                          }
                          lVar61 = lVar61 + 1;
                        } while ((local_ad4.bigend.vect[0] - local_ad4.smallend.vect[0]) + 1 !=
                                 (int)lVar61);
                      }
                      iVar95 = iVar95 + 1;
                      iVar11 = iVar11 + 1;
                      bVar110 = iVar15 != local_ad4.bigend.vect[1];
                      iVar15 = iVar15 + 1;
                    } while (bVar110);
                  }
                  bVar110 = iVar1 != local_ad4.bigend.vect[2];
                  iVar1 = iVar1 + 1;
                  iVar13 = iVar13 + 1;
                  iVar12 = iVar12 + 1;
                } while (bVar110);
              }
              local_f60 = local_f60 + 1;
              local_f50 = local_f50 + 8;
            } while (local_f60 != local_d00);
          }
        }
        else {
          lVar100 = (long)local_ad4.bigend.vect[0];
          lVar47 = (long)local_ad4.bigend.vect[1];
          lVar65 = (long)local_ad4.bigend.vect[2];
          lVar82 = (long)local_af0.smallend.vect[0];
          lVar104 = (long)local_af0.smallend.vect[1];
          lVar60 = (long)local_af0.smallend.vect[2];
          lVar61 = (long)local_af0.bigend.vect[0];
          lVar66 = (long)local_af0.bigend.vect[1];
          lVar75 = (long)local_af0.bigend.vect[2];
          uVar68 = local_ad4.bigend.vect[2] - local_ad4.smallend.vect[2];
          uVar10 = local_ad4.bigend.vect[1] - local_ad4.smallend.vect[1];
          if ((local_778 & 1) != 0) {
            uVar10 = uVar68;
          }
          uVar71 = local_ad4.bigend.vect[0] - local_ad4.smallend.vect[0];
          if ((local_7d8 & 1) == 0) {
            uVar10 = uVar71;
          }
          if (0x1f < (int)uVar10) {
            Abort_host("abec_gsrb_with_line_solve is hard-wired to be no longer than 32");
          }
          local_7e8 = lVar65;
          if (local_7dc == 2) {
            if (0 < (int)uVar44) {
              lVar47 = (long)iVar26;
              local_cb8 = CONCAT44(local_cb8._4_4_,iVar14 + 1);
              local_cc0 = CONCAT44(local_cc0._4_4_,iVar11 + 1);
              local_cc8 = CONCAT44(local_cc8._4_4_,iVar14 + 1);
              local_cd0 = (ulong)uVar68 * 8 + 8;
              lVar100 = lVar65 - lVar47;
              local_d38 = CONCAT44(local_d38._4_4_,iVar15 + 1);
              local_cf0 = CONCAT44(local_cf0._4_4_,iVar70 + 1);
              iVar91 = (iVar91 - iVar26) + 1;
              local_c70 = (ulong)(uVar10 + 1) * 8 - 8;
              local_cd8 = lVar61 * 8;
              local_ce0 = lVar82 * 8;
              local_ce8 = lVar47 + 1;
              local_d20 = (long)(int)uVar10 + 1;
              local_ea0 = 0;
              local_e98 = 0;
              do {
                if (iVar70 <= iVar28) {
                  local_d30 = CONCAT44(local_d30._4_4_,(int)local_cf0);
                  iVar90 = iVar70;
                  iVar92 = iVar70 + -1;
                  do {
                    lVar82 = (long)iVar90;
                    if (iVar15 <= iVar27) {
                      local_d28 = (long)(int)local_d30;
                      uVar86 = (ulong)(uint)(iVar90 + (int)local_cf8);
                      iVar72 = iVar15 + -1;
                      iVar45 = (int)local_d38;
                      local_d10 = uVar86;
                      iVar59 = iVar15;
                      do {
                        local_f88 = local_838.p;
                        LVar39 = local_8b8.kstride;
                        pdVar67 = local_8b8.p;
                        LVar37 = local_8f8.kstride;
                        local_f80 = local_8f8.p;
                        LVar33 = local_9b8.kstride;
                        pdVar32 = local_a38.p;
                        piVar19 = local_a78.p;
                        LVar31 = local_ab8.kstride;
                        LVar30 = local_ab8.jstride;
                        pdVar29 = local_ab8.p;
                        LVar25 = local_b30.kstride;
                        local_1018 = local_b30.p;
                        LVar23 = local_b70.kstride;
                        local_1038 = local_b70.p;
                        piVar17 = local_bb0.p;
                        LVar20 = local_bf0.kstride;
                        local_fe8 = local_bf0.p;
                        LVar18 = local_c30.kstride;
                        local_1048 = local_c30.p;
                        lVar104 = local_ce0;
                        pdVar64 = local_d78.p;
                        if (((int)uVar86 + iVar59 & 1U) == 0) {
                          local_d08 = (double *)CONCAT44(local_d08._4_4_,iVar45);
                          lVar66 = (long)iVar59;
                          lVar61 = lVar66 * 8;
                          if (iVar26 <= (int)lVar65) {
                            lVar77 = (long)local_bb0.begin.x;
                            lVar63 = (lVar82 - local_bb0.begin.y) * local_bb0.jstride;
                            local_c50 = local_978.p +
                                        (lVar82 - local_978.begin.y) * local_978.jstride +
                                        (lVar66 - local_978.begin.x) +
                                        (lVar60 - local_978.begin.z) * local_978.kstride;
                            lVar84 = (long)local_a78.begin.x;
                            lVar88 = (lVar82 - local_a78.begin.y) * local_a78.jstride;
                            lVar97 = local_878.kstride * 8;
                            lVar74 = local_9f8.kstride * 8;
                            lVar58 = local_938.kstride * 8;
                            lVar78 = local_7c8.kstride * 8;
                            uVar68 = ~local_b30.begin.x;
                            lVar56 = (~local_bb0.begin.z + iVar12) * local_bb0.kstride;
                            iVar46 = (int)local_cb8 - local_bf0.begin.x;
                            local_c58 = (int *)(local_978.nstride * local_e98);
                            local_c40 = (double *)
                                        (((int)local_cc0 - local_a78.begin.z) * local_a78.kstride);
                            lVar87 = local_878.nstride * local_ea0 +
                                     (lVar47 - local_878.begin.z) * lVar97 +
                                     (lVar82 - local_878.begin.y) * local_878.jstride * 8 +
                                     (long)local_878.begin.x * -8 + (long)local_878.p;
                            lVar79 = (lVar82 - local_8b8.begin.y) * local_8b8.jstride;
                            local_1020 = local_9f8.nstride * local_ea0 +
                                         (lVar47 - local_9f8.begin.z) * lVar74 +
                                         (iVar95 - local_9f8.begin.y) * local_9f8.jstride * 8 +
                                         (long)local_9f8.begin.x * -8 + (long)local_9f8.p;
                            local_c78 = (lVar82 - local_9b8.begin.y) * local_9b8.jstride;
                            local_f20 = local_938.nstride * local_ea0 +
                                        (lVar47 - local_938.begin.z) * lVar58 +
                                        (iVar13 - local_938.begin.y) * local_938.jstride * 8 +
                                        (long)local_938.begin.x * -8 + (long)local_938.p;
                            lVar65 = local_ab8.nstride * local_ea0;
                            lVar89 = (lVar82 - local_8f8.begin.y) * local_8f8.jstride;
                            lVar81 = local_8b8.nstride * local_ea0;
                            lVar73 = (lVar82 - local_b30.begin.y) * local_b30.jstride;
                            local_c88 = (long)local_9b8.p + local_cd8;
                            lVar76 = (~local_b70.begin.y + iVar13) * local_b70.jstride;
                            local_c98 = local_9b8.nstride * local_ea0;
                            lVar80 = (lVar82 - local_bf0.begin.y) * local_bf0.jstride;
                            lVar57 = ((iVar95 + 1) - local_c30.begin.y) * local_c30.jstride;
                            local_c80 = local_8f8.nstride * local_ea0;
                            lVar103 = (lVar47 - local_7c8.begin.z) * lVar78 +
                                      (lVar82 - local_7c8.begin.y) * local_7c8.jstride * 8 +
                                      (long)local_7c8.begin.x * -8 + (long)local_7c8.p;
                            lVar101 = (long)local_ab8.begin.x;
                            lVar105 = (long)local_ab8.begin.y;
                            lVar106 = (long)local_ab8.begin.z;
                            lVar48 = (long)local_8b8.begin.x;
                            lVar49 = (long)local_8b8.begin.z;
                            local_c90 = (long)local_b30.begin.z;
                            local_ca0 = (long)local_8f8.begin.x;
                            local_ca8 = (long)local_8f8.begin.z;
                            lVar50 = (long)local_b70.begin.x;
                            local_d18 = (long)local_b70.begin.z;
                            lVar51 = (long)local_bf0.begin.z;
                            lVar52 = (long)local_9b8.begin.x;
                            lVar53 = (long)local_9b8.begin.z;
                            lVar54 = (long)local_c30.begin.x;
                            lVar55 = (long)local_c30.begin.z;
                            memset(local_648,0,local_cd0);
                            local_c60 = pdVar32 + (lVar82 - local_a38.begin.y) * local_a38.jstride +
                                                  (lVar66 - local_a38.begin.x) +
                                                  (lVar75 - local_a38.begin.z) * local_a38.kstride;
                            local_c48 = piVar17 + (lVar82 - local_bb0.begin.y) * local_bb0.jstride +
                                                  (lVar66 - local_bb0.begin.x);
                            lVar62 = (long)local_d78.begin.x;
                            local_c68 = pdVar64 + (iVar90 - local_d78.begin.y) * local_d78.jstride +
                                                  (long)(iVar59 - local_d78.begin.x) +
                                                  local_d78.nstride * local_e98;
                            lVar102 = LVar31 * 8;
                            lVar106 = (lVar47 - lVar106) * lVar102;
                            lVar85 = (local_d28 - lVar105) * LVar30 * 8 + lVar106 + lVar65 +
                                     lVar101 * -8 + (long)pdVar29;
                            lVar105 = (lVar82 - lVar105) * LVar30 * 8 + lVar106 + lVar65 +
                                      lVar101 * -8 + (long)pdVar29;
                            lVar65 = local_d78.kstride * 8;
                            lVar106 = (lVar47 - local_d78.begin.z) * lVar65;
                            lVar101 = local_d78.jstride * 8;
                            lVar83 = local_d78.nstride * local_ea0;
                            local_cb0 = (double *)
                                        ((iVar92 - local_d78.begin.y) * lVar101 + lVar106 + lVar83);
                            lVar93 = (lVar82 - local_d78.begin.y) * lVar101;
                            local_f88 = (double *)
                                        (local_838.nstride * local_ea0 +
                                         (lVar47 - local_838.begin.z) * local_838.kstride * 8 +
                                         (lVar82 - local_838.begin.y) * local_838.jstride * 8 +
                                         (long)local_838.begin.x * -8 + (long)local_f88);
                            local_ff0 = (double *)
                                        ((lVar47 - lVar53) * LVar33 * 8 + local_c78 * 8 + local_c98
                                         + lVar52 * -8 + local_c88);
                            local_f80 = (double *)
                                        ((long)local_f80 +
                                        (lVar47 - local_ca8) * LVar37 * 8 + lVar89 * 8 + local_c80 +
                                        local_ca0 * -8 + lVar104);
                            local_f08 = (int *)((lVar47 - local_c90) * LVar25 * 4 + lVar73 * 4 +
                                                (long)(int)(uVar68 + iVar1) * 4 + (long)local_1018);
                            local_1018 = (int *)((lVar47 - local_b30.begin.z) *
                                                 local_b30.kstride * 4 +
                                                 (lVar82 - local_b30.begin.y) * local_b30.jstride *
                                                 4 + (long)(~local_b30.begin.x + iVar1) * 4 +
                                                (long)local_1018);
                            local_1010 = (int *)((lVar47 - lVar51) * LVar20 * 4 + lVar80 * 4 +
                                                 (long)iVar46 * 4 + (long)local_fe8);
                            local_fe8 = (int *)((lVar47 - local_bf0.begin.z) * local_bf0.kstride * 4
                                                + (lVar82 - local_bf0.begin.y) * local_bf0.jstride *
                                                  4 + (long)((int)local_cc8 - local_bf0.begin.x) * 4
                                               + (long)local_fe8);
                            local_1030 = (lVar47 - local_d18) * LVar23 * 4 + lVar76 * 4 +
                                         lVar50 * -4 + (long)local_1038;
                            local_1038 = (int *)((lVar47 - local_b70.begin.z) *
                                                 local_b70.kstride * 4 +
                                                 (~local_b70.begin.y + iVar13) * local_b70.jstride *
                                                 4 + (long)local_b70.begin.x * -4 + (long)local_1038
                                                );
                            local_fe0 = (lVar47 - lVar55) * LVar18 * 4 + lVar57 * 4 + lVar54 * -4 +
                                        (long)local_1048;
                            local_1048 = (int *)((lVar47 - local_c30.begin.z) *
                                                 local_c30.kstride * 4 +
                                                 ((iVar95 + 1) - local_c30.begin.y) *
                                                 local_c30.jstride * 4 +
                                                 (long)local_c30.begin.x * -4 + (long)local_1048);
                            lVar104 = lVar106 + lVar93;
                            lVar101 = (local_d28 - local_d78.begin.y) * lVar101 + lVar106 + lVar83 +
                                      lVar62 * -8 + (long)pdVar64;
                            lVar53 = (long)(local_cb0 + -lVar62) + (long)pdVar64;
                            lVar50 = lVar104 + lVar62 * -8 + (long)pdVar64;
                            lVar52 = lVar104 + (long)(iVar72 - local_d78.begin.x) * 8 +
                                     (long)pdVar64;
                            lVar51 = (local_ce8 - (long)local_d78.begin.z) * lVar65 + lVar62 * -8 +
                                     (long)pdVar64;
                            lVar104 = LVar39 * 8;
                            lVar106 = (lVar47 - lVar49) * lVar104 + lVar79 * 8 + lVar81 +
                                      lVar48 * -8 + (long)pdVar67;
                            lVar79 = (local_ce8 - lVar49) * lVar104 + lVar79 * 8 + lVar81 +
                                     lVar48 * -8 + (long)pdVar67;
                            lVar81 = 0;
                            do {
                              dVar113 = *(double *)(lVar87 + lVar66 * 8);
                              dVar116 = *(double *)(lVar87 + (long)iVar45 * 8);
                              dVar123 = *(double *)(lVar103 + lVar66 * 8);
                              dVar128 = *(double *)(lVar105 + lVar66 * 8);
                              dVar127 = *(double *)(lVar85 + lVar66 * 8);
                              dVar3 = *(double *)(lVar106 + lVar66 * 8);
                              dVar4 = *(double *)(lVar79 + lVar66 * 8);
                              dVar124 = 0.0;
                              dVar117 = 0.0;
                              if ((iVar59 == iVar1) && (0 < *local_f08)) {
                                dVar117 = *local_f80;
                              }
                              if ((iVar90 == iVar13) && (0 < *(int *)(local_1030 + lVar66 * 4))) {
                                dVar124 = *(double *)(local_f20 + lVar61);
                              }
                              dVar125 = 0.0;
                              dVar131 = 0.0;
                              if ((lVar60 - lVar47 == lVar81) &&
                                 (0 < piVar17[lVar63 + (lVar66 - lVar77) + lVar56])) {
                                dVar131 = local_c50[(long)local_c58];
                              }
                              if ((iVar59 == iVar14) && (0 < *local_1010)) {
                                dVar125 = *local_ff0;
                              }
                              dVar126 = 0.0;
                              uVar111 = 0;
                              uVar112 = 0;
                              if ((iVar90 == iVar95) && (0 < *(int *)(local_fe0 + lVar66 * 4))) {
                                uVar111 = (undefined4)*(undefined8 *)(local_1020 + lVar61);
                                uVar112 = (undefined4)
                                          ((ulong)*(undefined8 *)(local_1020 + lVar61) >> 0x20);
                              }
                              if ((lVar75 - lVar47 == lVar81) &&
                                 (0 < piVar19[(long)local_c40 + lVar88 + (lVar66 - lVar84)])) {
                                dVar126 = local_c60[local_a38.nstride * local_e98];
                              }
                              dVar118 = *(double *)(lVar50 + (long)iVar45 * 8 + lVar83);
                              dVar5 = *(double *)(lVar53 + lVar66 * 8);
                              dVar6 = *(double *)(lVar101 + lVar66 * 8);
                              dVar129 = (dVar113 * *(double *)(lVar52 + lVar83) + dVar116 * dVar118)
                                        * dVar119 + (dVar128 * dVar5 + dVar127 * dVar6) * dVar122;
                              if ((iVar59 == iVar1) && (0 < *local_1018)) {
                                dVar129 = dVar129 - dVar119 * dVar113 * *(double *)(lVar52 + lVar83)
                                ;
                              }
                              if ((iVar59 == iVar14) && (0 < *local_fe8)) {
                                dVar129 = dVar129 - dVar119 * dVar116 * dVar118;
                              }
                              if ((iVar90 == iVar13) &&
                                 (0 < *(int *)((long)local_1038 + lVar66 * 4))) {
                                dVar129 = dVar129 - dVar122 * dVar128 * dVar5;
                              }
                              if ((iVar90 == iVar95) &&
                                 (0 < *(int *)((long)local_1048 + lVar66 * 4))) {
                                dVar129 = dVar129 - dVar122 * dVar127 * dVar6;
                              }
                              (&local_448[0].p)[lVar81] = (int *)(dVar3 * local_6d8);
                              local_230[lVar81] =
                                   ((dVar3 + dVar4) * dVar115 +
                                   (dVar128 + dVar127) * dVar122 +
                                   dVar123 * local_c38 + (dVar113 + dVar116) * dVar119) -
                                   ((dVar131 * dVar3 + dVar126 * dVar4) * dVar115 +
                                   (dVar113 * dVar117 + dVar116 * dVar125) * dVar119 +
                                   (dVar128 * dVar124 + dVar127 * (double)CONCAT44(uVar112,uVar111))
                                   * dVar122);
                              adStack_330[lVar81] = dVar4 * local_6d8;
                              dVar129 = dVar129 + *(double *)((long)local_f88 + lVar61);
                              local_548[lVar81] = dVar129;
                              if ((lVar81 == 0) &&
                                 (local_448[0].p = (int *)0x0,
                                 local_c48[(~local_bb0.begin.z + iVar12) * local_bb0.kstride] < 1))
                              {
                                local_548[0] = dVar3 * dVar115 *
                                               local_c68[((iVar26 + -1) - local_d78.begin.z) *
                                                         local_d78.kstride] + dVar129;
                              }
                              if ((lVar100 == lVar81) &&
                                 (adStack_330[lVar81] = 0.0,
                                 piVar19[(lVar82 - local_a78.begin.y) * local_a78.jstride +
                                         (lVar66 - local_a78.begin.x) +
                                         ((iVar11 + 1) - local_a78.begin.z) * local_a78.kstride] < 1
                                 )) {
                                local_548[lVar81] =
                                     dVar4 * dVar115 *
                                     *(double *)(lVar51 + lVar93 + lVar61 + lVar83) +
                                     local_548[lVar81];
                              }
                              lVar81 = lVar81 + 1;
                              lVar87 = lVar87 + lVar97;
                              lVar85 = lVar85 + lVar102;
                              lVar105 = lVar105 + lVar102;
                              lVar106 = lVar106 + lVar104;
                              lVar101 = lVar101 + lVar65;
                              lVar53 = lVar53 + lVar65;
                              lVar50 = lVar50 + lVar65;
                              lVar52 = lVar52 + lVar65;
                              local_f88 = (double *)((long)local_f88 + local_838.kstride * 8);
                              local_1020 = local_1020 + lVar74;
                              local_ff0 = local_ff0 + LVar33;
                              local_f20 = local_f20 + lVar58;
                              local_f80 = local_f80 + LVar37;
                              local_f08 = local_f08 + LVar25;
                              local_1030 = local_1030 + LVar23 * 4;
                              local_1010 = local_1010 + LVar20;
                              local_fe0 = local_fe0 + LVar18 * 4;
                              local_1018 = local_1018 + local_b30.kstride;
                              local_fe8 = local_fe8 + local_bf0.kstride;
                              local_1038 = (int *)((long)local_1038 + local_b70.kstride * 4);
                              local_1048 = (int *)((long)local_1048 + local_c30.kstride * 4);
                              lVar103 = lVar103 + lVar78;
                              lVar51 = lVar51 + lVar65;
                              lVar79 = lVar79 + lVar104;
                            } while (iVar91 != (int)lVar81);
                          }
                          uVar86 = local_c70;
                          local_648[0] = local_548[0] / local_230[0];
                          if (0 < (int)uVar10) {
                            uVar69 = 0;
                            dVar113 = local_230[0];
                            do {
                              dVar113 = *(double *)((long)adStack_330 + uVar69) / dVar113;
                              *(double *)((long)adStack_128 + uVar69) = dVar113;
                              dVar116 = *(double *)((long)&local_448[0].jstride + uVar69);
                              dVar113 = *(double *)((long)local_230 + uVar69 + 8) -
                                        dVar113 * dVar116;
                              if ((dVar113 == 0.0) && (!NAN(dVar113))) {
                                Abort_host(">>>TRIDIAG FAILED");
                              }
                              *(double *)((long)local_648 + uVar69 + 8) =
                                   (-dVar116 * *(double *)((long)local_648 + uVar69) +
                                   *(double *)((long)local_548 + uVar69 + 8)) / dVar113;
                              uVar69 = uVar69 + 8;
                            } while (uVar86 != uVar69);
                          }
                          if (0 < (int)uVar10) {
                            dVar113 = local_648[(int)uVar10];
                            lVar65 = local_d20;
                            do {
                              dVar113 = local_648[lVar65 + -2] - dVar113 * adStack_128[lVar65 + -2];
                              local_648[lVar65 + -2] = dVar113;
                              lVar65 = lVar65 + -1;
                            } while (1 < lVar65);
                          }
                          uVar86 = local_d10;
                          lVar65 = local_7e8;
                          iVar45 = (int)local_d08;
                          if (iVar26 <= (int)local_7e8) {
                            pdVar64 = (double *)
                                      (local_d78.nstride * local_ea0 + lVar61 +
                                       (lVar47 - local_d78.begin.z) * local_d78.kstride * 8 +
                                       (lVar82 - local_d78.begin.y) * local_d78.jstride * 8 +
                                       (long)local_d78.begin.x * -8 + (long)local_d78.p);
                            lVar104 = 0;
                            do {
                              *pdVar64 = local_648[lVar104];
                              lVar104 = lVar104 + 1;
                              pdVar64 = pdVar64 + local_d78.kstride;
                            } while (iVar91 != (int)lVar104);
                          }
                        }
                        iVar45 = iVar45 + 1;
                        iVar72 = iVar72 + 1;
                        bVar110 = iVar59 != iVar27;
                        iVar59 = iVar59 + 1;
                      } while (bVar110);
                    }
                    local_d30 = CONCAT44(local_d30._4_4_,(int)local_d30 + 1);
                    iVar92 = iVar92 + 1;
                    bVar110 = iVar90 != iVar28;
                    iVar90 = iVar90 + 1;
                  } while (bVar110);
                }
                local_e98 = local_e98 + 1;
                local_ea0 = local_ea0 + 8;
              } while (local_e98 != local_d00);
            }
          }
          else if (local_7dc == 1) {
            if (0 < (int)uVar44) {
              lVar100 = (long)iVar70;
              local_cd0 = CONCAT44(local_cd0._4_4_,iVar14 + 1);
              local_d18 = CONCAT44(local_d18._4_4_,iVar95 + 1);
              local_cd8 = CONCAT44(local_cd8._4_4_,iVar11 + 1);
              local_ce0 = CONCAT44(local_ce0._4_4_,iVar14 + 1);
              local_ce8 = (ulong)(uint)(iVar28 - iVar70) * 8 + 8;
              local_cb8 = (long)(int)uVar10;
              local_c40 = (double *)(lVar100 - lVar47);
              local_7d0 = iVar15 + 1;
              iVar95 = (iVar28 - iVar70) + 1;
              local_c78 = (ulong)(uVar10 + 1) * 8 + -8;
              local_7cc = iVar26 + -1;
              local_7d4 = iVar15 + -1;
              local_d30 = lVar61 * 8;
              local_d38 = lVar82 * 8;
              local_cf0 = lVar100 + 1;
              local_cc0 = local_cb8 + 1;
              local_ec0 = 0;
              local_df0 = 0;
              do {
                if (iVar15 <= iVar27) {
                  local_d28 = CONCAT44(local_d28._4_4_,local_7d4);
                  local_ec4 = local_7d0;
                  iVar91 = iVar15;
                  do {
                    if (iVar26 <= (int)lVar65) {
                      lVar47 = (long)iVar91;
                      local_cc8 = lVar47 * 8;
                      uVar86 = (ulong)(uint)(iVar91 + (int)local_cf8);
                      iVar90 = local_7cc;
                      local_c70 = uVar86;
                      iVar72 = iVar26;
                      iVar92 = iVar26;
                      do {
                        pdVar34 = local_838.p;
                        LVar39 = local_8b8.kstride;
                        LVar37 = local_8b8.jstride;
                        pdVar67 = local_8b8.p;
                        LVar33 = local_8f8.jstride;
                        local_f88 = local_8f8.p;
                        pdVar32 = local_938.p;
                        LVar31 = local_9b8.jstride;
                        local_f80 = local_9b8.p;
                        LVar30 = local_a78.jstride;
                        piVar22 = local_a78.p;
                        LVar25 = local_ab8.jstride;
                        pdVar29 = local_ab8.p;
                        LVar23 = local_b30.jstride;
                        local_1038 = local_b30.p;
                        piVar21 = local_b70.p;
                        LVar20 = local_bb0.jstride;
                        piVar19 = local_bb0.p;
                        LVar18 = local_bf0.jstride;
                        local_1048 = local_bf0.p;
                        piVar17 = local_c30.p;
                        lVar60 = local_d30;
                        lVar82 = local_d38;
                        pdVar64 = local_d78.p;
                        iVar92 = iVar92 + 1;
                        lVar61 = (long)iVar72;
                        if ((iVar72 + (int)uVar86 & 1U) == 0) {
                          local_d10 = CONCAT44(local_d10._4_4_,iVar92);
                          if (iVar70 <= iVar28) {
                            lVar76 = (long)local_b70.begin.x;
                            lVar83 = (~local_b70.begin.y + iVar13) * local_b70.jstride;
                            lVar77 = (long)local_938.begin.x;
                            lVar84 = (lVar104 - local_938.begin.y) * local_938.jstride;
                            lVar87 = (lVar61 - local_938.begin.z) * local_938.kstride;
                            local_c58 = local_c30.p +
                                        ((int)local_d18 - local_c30.begin.y) * local_c30.jstride +
                                        (lVar47 - local_c30.begin.x);
                            local_c68 = local_9f8.p +
                                        (lVar66 - local_9f8.begin.y) * local_9f8.jstride +
                                        (lVar47 - local_9f8.begin.x) +
                                        (lVar61 - local_9f8.begin.z) * local_9f8.kstride;
                            lVar93 = local_878.jstride * 8;
                            lVar88 = local_978.jstride * 8;
                            lVar75 = local_7c8.jstride * 8;
                            uVar68 = ~local_b30.begin.x;
                            local_c48 = (int *)((lVar61 - local_b70.begin.z) * local_b70.kstride);
                            lVar78 = local_938.nstride * local_df0;
                            iVar45 = (int)local_cd0 - local_bf0.begin.x;
                            local_c50 = (double *)((lVar61 - local_c30.begin.z) * local_c30.kstride)
                            ;
                            lVar79 = local_9f8.nstride * local_df0;
                            local_1050 = local_878.nstride * local_ec0 +
                                         (lVar100 - local_878.begin.y) * lVar93 +
                                         (lVar61 - local_878.begin.z) * local_878.kstride * 8 +
                                         (long)local_878.begin.x * -8 + (long)local_878.p;
                            lVar73 = (lVar61 - local_ab8.begin.z) * local_ab8.kstride;
                            lVar81 = local_ab8.nstride * local_ec0;
                            lVar65 = local_8b8.nstride * local_ec0;
                            local_c90 = (lVar61 - local_9b8.begin.z) * local_9b8.kstride;
                            local_c98 = local_9b8.nstride * local_ec0;
                            local_f20 = local_978.nstride * local_ec0 +
                                        (lVar100 - local_978.begin.y) * lVar88 +
                                        (iVar12 - local_978.begin.z) * local_978.kstride * 8 +
                                        (long)local_978.begin.x * -8 + (long)local_978.p;
                            lVar85 = (lVar61 - local_8f8.begin.z) * local_8f8.kstride;
                            lVar101 = local_8f8.nstride * local_ec0;
                            lVar80 = (lVar61 - local_b30.begin.z) * local_b30.kstride;
                            lVar62 = (~local_bb0.begin.z + iVar12) * local_bb0.kstride;
                            lVar89 = (lVar61 - local_bf0.begin.z) * local_bf0.kstride;
                            lVar102 = (lVar100 - local_7c8.begin.y) * lVar75 +
                                      (lVar61 - local_7c8.begin.z) * local_7c8.kstride * 8 +
                                      (long)local_7c8.begin.x * -8 + (long)local_7c8.p;
                            lVar105 = (long)local_ab8.begin.x;
                            lVar106 = (long)local_ab8.begin.y;
                            lVar48 = (long)local_8b8.begin.x;
                            lVar49 = (long)local_8b8.begin.y;
                            lVar50 = (long)local_8b8.begin.z;
                            local_c88 = (long)local_b30.begin.y;
                            local_ca8 = (long)local_8f8.begin.x;
                            lVar51 = (long)local_8f8.begin.y;
                            lVar52 = (long)local_bb0.begin.x;
                            local_c80 = (long)local_bb0.begin.y;
                            lVar53 = (long)local_bf0.begin.y;
                            lVar54 = (long)local_9b8.begin.x;
                            lVar55 = (long)local_9b8.begin.y;
                            lVar56 = (long)local_a78.begin.x;
                            lVar57 = (long)local_a78.begin.y;
                            local_cb0 = local_a38.p;
                            memset(local_648,0,local_ce8);
                            local_ca0 = CONCAT44(local_ca0._4_4_,(int)local_cd8 - local_a78.begin.z)
                            ;
                            local_c60 = (double *)
                                        (piVar21 +
                                        (~local_b70.begin.y + iVar13) * local_b70.jstride +
                                        (lVar47 - local_b70.begin.x));
                            lVar58 = (long)local_d78.begin.x;
                            lVar63 = lVar61 - local_d78.begin.z;
                            local_d08 = pdVar64 + (lVar47 - lVar58) +
                                                  local_d78.kstride * lVar63 +
                                                  local_d78.nstride * local_df0;
                            lVar74 = LVar37 * 8;
                            lVar49 = (lVar100 - lVar49) * lVar74;
                            lVar97 = (lVar61 - lVar50) * LVar39 * 8 + lVar49 + lVar65 + lVar48 * -8
                                     + (long)pdVar67;
                            lVar103 = (iVar92 - lVar50) * LVar39 * 8 + lVar49 + lVar65 + lVar48 * -8
                                      + (long)pdVar67;
                            lVar65 = local_d78.jstride * 8;
                            lVar48 = (lVar100 - local_d78.begin.y) * lVar65;
                            lVar49 = local_d78.kstride * 8;
                            lVar50 = local_d78.nstride * local_ec0;
                            local_d20 = (iVar90 - local_d78.begin.z) * lVar49 + lVar48 + lVar50;
                            lVar63 = lVar49 * lVar63;
                            local_f08 = (int *)(local_838.nstride * local_ec0 +
                                                (lVar100 - local_838.begin.y) *
                                                local_838.jstride * 8 +
                                                (lVar61 - local_838.begin.z) * local_838.kstride * 8
                                                + (long)local_838.begin.x * -8 + (long)pdVar34);
                            local_ff0 = (double *)
                                        (local_a38.nstride * local_ec0 +
                                         (lVar100 - local_a38.begin.y) * local_a38.jstride * 8 +
                                         (iVar11 - local_a38.begin.z) * local_a38.kstride * 8 +
                                         (long)local_a38.begin.x * -8 + (long)local_cb0);
                            local_f80 = (double *)
                                        ((long)local_f80 +
                                        (lVar100 - lVar55) * LVar31 * 8 + local_c90 * 8 + local_c98
                                        + lVar54 * -8 + lVar60);
                            local_f88 = (double *)
                                        ((long)local_f88 +
                                        (lVar100 - lVar51) * LVar33 * 8 + lVar85 * 8 + lVar101 +
                                        local_ca8 * -8 + lVar82);
                            local_1010 = (int *)((lVar100 - local_c88) * LVar23 * 4 + lVar80 * 4 +
                                                 (long)(int)(uVar68 + iVar1) * 4 + (long)local_1038)
                            ;
                            local_1038 = (int *)((lVar100 - local_b30.begin.y) *
                                                 local_b30.jstride * 4 +
                                                 (lVar61 - local_b30.begin.z) * local_b30.kstride *
                                                 4 + (long)(~local_b30.begin.x + iVar1) * 4 +
                                                (long)local_1038);
                            local_1018 = (int *)((lVar100 - lVar53) * LVar18 * 4 + lVar89 * 4 +
                                                 (long)iVar45 * 4 + (long)local_1048);
                            local_1048 = (int *)((lVar100 - local_bf0.begin.y) *
                                                 local_bf0.jstride * 4 +
                                                 (lVar61 - local_bf0.begin.z) * local_bf0.kstride *
                                                 4 + (long)((int)local_ce0 - local_bf0.begin.x) * 4
                                                + (long)local_1048);
                            local_fe0 = (lVar100 - local_c80) * LVar20 * 4 + lVar62 * 4 +
                                        lVar52 * -4 + (long)piVar19;
                            local_1020 = (lVar100 - local_bb0.begin.y) * local_bb0.jstride * 4 +
                                         (~local_bb0.begin.z + iVar12) * local_bb0.kstride * 4 +
                                         (long)local_bb0.begin.x * -4 + (long)piVar19;
                            local_fe8 = (int *)((long)((int)local_cd8 - local_a78.begin.z) *
                                                local_a78.kstride * 4 +
                                                (lVar100 - lVar57) * LVar30 * 4 + lVar56 * -4 +
                                               (long)piVar22);
                            local_fc0 = local_a78.kstride * 4 *
                                        (long)((iVar11 + 1) - local_a78.begin.z) +
                                        (lVar100 - local_a78.begin.y) * local_a78.jstride * 4 +
                                        (long)local_a78.begin.x * -4 + (long)piVar22;
                            lVar60 = lVar48 + lVar63 + lVar50;
                            lVar48 = ((long)iVar92 - (long)local_d78.begin.z) * lVar49 + lVar48 +
                                     lVar50 + lVar58 * -8 + (long)pdVar64;
                            lVar49 = local_d20 + lVar58 * -8 + (long)pdVar64;
                            lVar82 = lVar60 + lVar58 * -8 + (long)pdVar64;
                            pdVar67 = (double *)
                                      ((long)((int)local_d28 - local_d78.begin.x) * 8 + lVar60 +
                                      (long)pdVar64);
                            local_fc8 = (local_cf0 - local_d78.begin.y) * lVar65 + lVar63 + lVar50 +
                                        lVar58 * -8 + (long)pdVar64;
                            lVar60 = local_ab8.jstride * 8;
                            lVar50 = (lVar61 - local_ab8.begin.z) * local_ab8.kstride;
                            lVar51 = (local_cf0 - local_ab8.begin.y) * lVar60 + lVar50 * 8 +
                                     local_ab8.nstride * local_ec0 + (long)local_ab8.begin.x * -8;
                            lVar52 = LVar25 * 8;
                            lVar101 = (lVar100 - lVar106) * lVar52 + lVar73 * 8 + lVar81 +
                                      lVar105 * -8 + (long)pdVar29;
                            local_f40 = (lVar100 - local_ab8.begin.y) * lVar60 + lVar50 * 8 +
                                        local_ab8.nstride * local_ec0 + (long)local_ab8.begin.x * -8
                                        + (long)pdVar29;
                            local_f90 = (long)pdVar29 + lVar51;
                            lVar51 = lVar51 + (long)pdVar29;
                            lVar105 = (local_cf0 - lVar106) * lVar52 + lVar73 * 8 + lVar81 +
                                      lVar105 * -8 + (long)pdVar29;
                            lVar81 = 0;
                            do {
                              dVar113 = *(double *)(local_1050 + lVar47 * 8);
                              dVar116 = *(double *)(local_1050 + (long)local_ec4 * 8);
                              dVar123 = *(double *)(lVar102 + lVar47 * 8);
                              dVar128 = *(double *)(lVar101 + lVar47 * 8);
                              dVar127 = *(double *)(lVar105 + lVar47 * 8);
                              dVar3 = *(double *)(lVar97 + lVar47 * 8);
                              dVar4 = *(double *)(lVar103 + lVar47 * 8);
                              dVar124 = 0.0;
                              dVar117 = 0.0;
                              if ((iVar91 == iVar1) && (0 < *local_1010)) {
                                dVar117 = *local_f88;
                              }
                              if (((lVar100 - lVar104) + lVar81 == 0) &&
                                 (0 < piVar21[(long)local_c48 + lVar83 + (lVar47 - lVar76)])) {
                                dVar124 = pdVar32[lVar84 + (lVar47 - lVar77) + lVar87 + lVar78];
                              }
                              dVar125 = 0.0;
                              dVar131 = 0.0;
                              if ((iVar72 == iVar12) && (0 < *(int *)(local_fe0 + lVar47 * 4))) {
                                dVar131 = *(double *)(local_f20 + lVar47 * 8);
                              }
                              if ((iVar91 == iVar14) && (0 < *local_1018)) {
                                dVar125 = *local_f80;
                              }
                              dVar118 = 0.0;
                              dVar126 = 0.0;
                              if (((lVar100 - lVar66) + lVar81 == 0) &&
                                 (0 < local_c58[(long)local_c50])) {
                                dVar126 = local_c68[lVar79];
                              }
                              if ((iVar72 == iVar11) && (0 < *(int *)((long)local_fe8 + lVar47 * 4))
                                 ) {
                                dVar118 = *(double *)((long)local_ff0 + lVar47 * 8);
                              }
                              dVar5 = *(double *)(lVar82 + (long)local_ec4 * 8);
                              dVar6 = *(double *)(lVar49 + lVar47 * 8);
                              dVar129 = *(double *)(lVar48 + lVar47 * 8);
                              dVar130 = (dVar113 * *pdVar67 + dVar116 * dVar5) * dVar119 +
                                        (dVar3 * dVar6 + dVar4 * dVar129) * dVar115;
                              if ((iVar91 == iVar1) && (0 < *local_1038)) {
                                dVar130 = dVar130 - dVar119 * dVar113 * *pdVar67;
                              }
                              if ((iVar91 == iVar14) && (0 < *local_1048)) {
                                dVar130 = dVar130 - dVar119 * dVar116 * dVar5;
                              }
                              if ((iVar72 == iVar12) && (0 < *(int *)(local_1020 + lVar47 * 4))) {
                                dVar130 = dVar130 - dVar115 * dVar3 * dVar6;
                              }
                              if ((iVar72 == iVar11) && (0 < *(int *)(local_fc0 + lVar47 * 4))) {
                                dVar130 = dVar130 - dVar115 * dVar4 * dVar129;
                              }
                              (&local_448[0].p)[lVar81] = (int *)(dVar128 * local_6c8);
                              local_230[lVar81] =
                                   ((dVar3 + dVar4) * dVar115 +
                                   (dVar128 + dVar127) * dVar122 +
                                   dVar123 * local_c38 + (dVar113 + dVar116) * dVar119) -
                                   ((dVar3 * dVar131 + dVar4 * dVar118) * dVar115 +
                                   (dVar113 * dVar117 + dVar116 * dVar125) * dVar119 +
                                   (dVar124 * dVar128 + dVar127 * dVar126) * dVar122);
                              adStack_330[lVar81] = *(double *)(lVar51 + lVar47 * 8) * local_6c8;
                              local_548[lVar81] =
                                   dVar130 + *(double *)((long)local_f08 + lVar47 * 8);
                              if ((lVar81 == 0) &&
                                 (local_448[0].p = (int *)0x0,
                                 *(int *)((long)local_c60 +
                                         (lVar61 - local_b70.begin.z) * local_b70.kstride * 4) < 1))
                              {
                                local_548[0] = *(double *)(local_f40 + lVar47 * 8) * dVar122 *
                                               local_d08[((iVar70 + -1) - local_d78.begin.y) *
                                                         local_d78.jstride] + local_548[0];
                              }
                              if (((long)local_c40 + lVar81 == 0) &&
                                 (adStack_330[lVar81] = 0.0,
                                 piVar17[((int)local_d18 - local_c30.begin.y) * local_c30.jstride +
                                         (lVar47 - local_c30.begin.x) +
                                         (lVar61 - local_c30.begin.z) * local_c30.kstride] < 1)) {
                                local_548[lVar81] =
                                     *(double *)(local_f90 + lVar47 * 8) * dVar122 *
                                     *(double *)(local_fc8 + lVar47 * 8) + local_548[lVar81];
                              }
                              lVar81 = lVar81 + 1;
                              local_1050 = local_1050 + lVar93;
                              lVar101 = lVar101 + lVar52;
                              lVar97 = lVar97 + lVar74;
                              lVar103 = lVar103 + lVar74;
                              lVar48 = lVar48 + lVar65;
                              lVar49 = lVar49 + lVar65;
                              lVar82 = lVar82 + lVar65;
                              pdVar67 = pdVar67 + local_d78.jstride;
                              local_f08 = (int *)((long)local_f08 + local_838.jstride * 8);
                              local_f40 = local_f40 + lVar60;
                              local_ff0 = (double *)((long)local_ff0 + local_a38.jstride * 8);
                              local_f80 = local_f80 + LVar31;
                              local_f20 = local_f20 + lVar88;
                              local_f88 = local_f88 + LVar33;
                              local_1010 = local_1010 + LVar23;
                              local_fe0 = local_fe0 + LVar20 * 4;
                              local_1018 = local_1018 + LVar18;
                              local_fe8 = (int *)((long)local_fe8 + LVar30 * 4);
                              local_1038 = local_1038 + local_b30.jstride;
                              local_1048 = local_1048 + local_bf0.jstride;
                              local_1020 = local_1020 + local_bb0.jstride * 4;
                              local_fc0 = local_fc0 + local_a78.jstride * 4;
                              lVar102 = lVar102 + lVar75;
                              local_fc8 = local_fc8 + lVar65;
                              local_f90 = local_f90 + lVar60;
                              lVar51 = lVar51 + lVar60;
                              lVar105 = lVar105 + lVar52;
                            } while (iVar95 != (int)lVar81);
                          }
                          lVar65 = local_c78;
                          local_648[0] = local_548[0] / local_230[0];
                          if (0 < (int)uVar10) {
                            lVar82 = 0;
                            dVar113 = local_230[0];
                            do {
                              dVar113 = *(double *)((long)adStack_330 + lVar82) / dVar113;
                              *(double *)((long)adStack_128 + lVar82) = dVar113;
                              dVar116 = *(double *)((long)&local_448[0].jstride + lVar82);
                              dVar113 = *(double *)((long)local_230 + lVar82 + 8) -
                                        dVar113 * dVar116;
                              if ((dVar113 == 0.0) && (!NAN(dVar113))) {
                                Abort_host(">>>TRIDIAG FAILED");
                              }
                              *(double *)((long)local_648 + lVar82 + 8) =
                                   (-dVar116 * *(double *)((long)local_648 + lVar82) +
                                   *(double *)((long)local_548 + lVar82 + 8)) / dVar113;
                              lVar82 = lVar82 + 8;
                            } while (lVar65 != lVar82);
                          }
                          if (0 < (int)uVar10) {
                            dVar113 = local_648[local_cb8];
                            lVar65 = local_cc0;
                            do {
                              dVar113 = local_648[lVar65 + -2] - dVar113 * adStack_128[lVar65 + -2];
                              local_648[lVar65 + -2] = dVar113;
                              lVar65 = lVar65 + -1;
                            } while (1 < lVar65);
                          }
                          uVar86 = local_c70;
                          lVar65 = local_7e8;
                          iVar92 = (int)local_d10;
                          if (iVar70 <= iVar28) {
                            pdVar64 = (double *)
                                      ((long)local_d78.p +
                                      local_d78.nstride * local_ec0 +
                                      (lVar100 - local_d78.begin.y) * local_d78.jstride * 8 +
                                      (lVar61 - local_d78.begin.z) * local_d78.kstride * 8 +
                                      (long)local_d78.begin.x * -8 + local_cc8);
                            lVar82 = 0;
                            do {
                              *pdVar64 = local_648[lVar82];
                              lVar82 = lVar82 + 1;
                              pdVar64 = pdVar64 + local_d78.jstride;
                            } while (iVar95 != (int)lVar82);
                          }
                        }
                        iVar90 = iVar90 + 1;
                        bVar110 = iVar72 != (int)lVar65;
                        iVar72 = iVar72 + 1;
                      } while (bVar110);
                    }
                    local_ec4 = local_ec4 + 1;
                    local_d28 = CONCAT44(local_d28._4_4_,(int)local_d28 + 1);
                    bVar110 = iVar91 != iVar27;
                    iVar91 = iVar91 + 1;
                  } while (bVar110);
                }
                local_df0 = local_df0 + 1;
                local_ec0 = local_ec0 + 8;
              } while (local_df0 != local_d00);
            }
          }
          else if (0 < (int)uVar44) {
            lVar104 = (long)iVar15;
            local_cd0 = CONCAT44(local_cd0._4_4_,iVar14 + 1);
            local_cd8 = CONCAT44(local_cd8._4_4_,iVar11 + 1);
            local_ce0 = CONCAT44(local_ce0._4_4_,iVar11 + 1);
            __n = (ulong)uVar71 * 8 + 8;
            local_d28 = (long)(int)uVar10;
            lVar47 = lVar104 * 8;
            local_cf0 = CONCAT44(local_cf0._4_4_,iVar26 + -1);
            local_ce8 = lVar104 * 4;
            local_d30 = CONCAT44(local_d30._4_4_,iVar15 + -1);
            local_cb8 = local_d28 + 1;
            local_fd0 = 0;
            local_1008 = 0;
            do {
              if (iVar70 <= iVar28) {
                local_cc8 = local_1008 * 8;
                local_d20 = CONCAT44(local_d20._4_4_,iVar70 + -1);
                local_d38 = CONCAT44(local_d38._4_4_,iVar70 + 1);
                iVar91 = iVar70;
                do {
                  if (iVar26 <= (int)lVar65) {
                    lVar60 = (long)iVar91;
                    local_cc0 = (long)(int)local_d38;
                    iVar92 = (int)local_cf8;
                    iVar72 = (int)local_cf0;
                    iVar45 = iVar26;
                    iVar90 = iVar26;
                    do {
                      pdVar42 = local_7c8.p;
                      pdVar41 = local_838.p;
                      pdVar40 = local_878.p;
                      LVar20 = local_8b8.kstride;
                      pdVar38 = local_8b8.p;
                      pdVar36 = local_8f8.p;
                      pdVar35 = local_938.p;
                      pdVar34 = local_978.p;
                      pdVar67 = local_9f8.p;
                      pdVar32 = local_a38.p;
                      LVar18 = local_ab8.jstride;
                      pdVar29 = local_ab8.p;
                      piVar24 = local_b30.p;
                      piVar22 = local_b70.p;
                      piVar21 = local_bb0.p;
                      piVar19 = local_bf0.p;
                      piVar17 = local_c30.p;
                      sVar16 = local_ce8;
                      pdVar64 = local_d78.p;
                      iVar90 = iVar90 + 1;
                      if ((iVar91 + iVar92 + iVar45 & 1U) == 0) {
                        lVar66 = (long)iVar45;
                        if (iVar15 <= iVar27) {
                          uVar68 = ~local_b30.begin.x;
                          lVar88 = (lVar60 - local_b30.begin.y) * local_b30.jstride;
                          lVar79 = (long)local_8f8.begin.x;
                          lVar89 = (lVar60 - local_8f8.begin.y) * local_8f8.jstride;
                          lVar97 = (lVar66 - local_8f8.begin.z) * local_8f8.kstride;
                          iVar59 = (int)local_cd0 - local_bf0.begin.x;
                          lVar102 = (lVar60 - local_bf0.begin.y) * local_bf0.jstride;
                          local_c40 = local_9b8.p +
                                      (lVar60 - local_9b8.begin.y) * local_9b8.jstride +
                                      (lVar61 - local_9b8.begin.x) +
                                      (lVar66 - local_9b8.begin.z) * local_9b8.kstride;
                          lVar63 = (lVar66 - local_b30.begin.z) * local_b30.kstride;
                          lVar81 = local_8f8.nstride * local_1008;
                          lVar101 = (lVar66 - local_bf0.begin.z) * local_bf0.kstride;
                          lVar85 = local_9b8.nstride * local_1008;
                          lVar65 = (lVar60 - local_878.begin.y) * local_878.jstride;
                          lVar78 = (lVar66 - local_878.begin.z) * local_878.kstride;
                          lVar75 = local_878.nstride * local_fd0;
                          lVar76 = (lVar66 - local_ab8.begin.z) * local_ab8.kstride;
                          lVar77 = local_ab8.nstride * local_fd0;
                          lVar80 = (lVar60 - local_8b8.begin.y) * local_8b8.jstride;
                          lVar56 = (iVar95 - local_9f8.begin.y) * local_9f8.jstride;
                          lVar57 = local_8b8.nstride * local_fd0;
                          lVar105 = (lVar66 - local_9f8.begin.z) * local_9f8.kstride;
                          lVar73 = (iVar12 - local_978.begin.z) * local_978.kstride;
                          lVar106 = (lVar60 - local_978.begin.y) * local_978.jstride;
                          lVar84 = (iVar13 - local_938.begin.y) * local_938.jstride;
                          lVar48 = local_9f8.nstride * local_fd0;
                          lVar49 = (lVar66 - local_938.begin.z) * local_938.kstride;
                          lVar50 = (lVar66 - local_b70.begin.z) * local_b70.kstride;
                          local_d08 = (double *)(local_978.nstride * local_fd0);
                          lVar93 = (~local_b70.begin.y + iVar13) * local_b70.jstride;
                          local_c58 = (int *)((lVar60 - local_bb0.begin.y) * local_bb0.jstride);
                          lVar51 = local_938.nstride * local_fd0;
                          local_c68 = (double *)((~local_bb0.begin.z + iVar12) * local_bb0.kstride);
                          lVar107 = (lVar66 - local_c30.begin.z) * local_c30.kstride;
                          lVar87 = ((iVar95 + 1) - local_c30.begin.y) * local_c30.jstride;
                          local_c60 = (double *)((lVar60 - local_a78.begin.y) * local_a78.jstride);
                          local_c48 = (int *)((long)local_a78.p + local_ce8);
                          lVar94 = (lVar60 - local_7c8.begin.y) * local_7c8.jstride;
                          local_c50 = (double *)((lVar66 - local_7c8.begin.z) * local_7c8.kstride);
                          lVar52 = (long)local_7c8.begin.x;
                          lVar58 = (long)local_878.begin.x;
                          lVar98 = (long)local_ab8.begin.x;
                          lVar108 = (long)local_ab8.begin.y;
                          local_cb0 = (double *)(long)local_8b8.begin.x;
                          lVar53 = (long)local_8b8.begin.z;
                          local_c70 = (ulong)local_b70.begin.x;
                          local_c78 = (long)local_938.begin.x;
                          lVar54 = (long)local_bb0.begin.x;
                          local_c80 = (long)local_978.begin.x;
                          local_d10 = (ulong)local_c30.begin.x;
                          local_c90 = (long)local_9f8.begin.x;
                          lVar55 = (long)local_a78.begin.x;
                          memset(local_648,0,__n);
                          local_c98 = CONCAT44(local_c98._4_4_,iVar11 - local_a38.begin.z);
                          local_c88 = CONCAT44(local_c88._4_4_,(int)local_cd8 - local_a78.begin.z);
                          local_d18 = CONCAT44(local_d18._4_4_,(int)local_ce0 - local_a78.begin.z);
                          local_ca0 = lVar66 - local_b30.begin.z;
                          local_ca8 = local_d78.jstride;
                          lVar78 = lVar78 * 8 + lVar65 * 8 + lVar75 + lVar58 * -8 + lVar47;
                          lVar58 = lVar66 - local_d78.begin.z;
                          lVar65 = local_d78.jstride * 8;
                          lVar75 = local_d78.kstride * 8;
                          lVar62 = lVar75 * lVar58;
                          lVar96 = local_d78.nstride * local_fd0;
                          lVar74 = lVar60 - local_d78.begin.y;
                          lVar83 = lVar65 * lVar74;
                          lVar103 = (long)local_d78.begin.x;
                          lVar99 = 0;
                          do {
                            dVar113 = *(double *)((long)pdVar40 + lVar99 * 8 + lVar78);
                            dVar116 = *(double *)((long)pdVar40 + lVar99 * 8 + lVar78 + 8);
                            dVar123 = pdVar42[(long)local_c50 +
                                              lVar104 + ((lVar94 + lVar99) - lVar52)];
                            dVar128 = *(double *)
                                       ((long)pdVar29 +
                                       lVar99 * 8 +
                                       (lVar60 - lVar108) * LVar18 * 8 + lVar76 * 8 + lVar77 +
                                       lVar98 * -8 + lVar47);
                            dVar127 = *(double *)
                                       ((long)pdVar29 +
                                       lVar99 * 8 +
                                       (local_cc0 - lVar108) * LVar18 * 8 + lVar76 * 8 + lVar77 +
                                       lVar98 * -8 + lVar47);
                            dVar3 = *(double *)
                                     ((long)pdVar38 +
                                     lVar99 * 8 +
                                     (lVar66 - lVar53) * LVar20 * 8 + lVar80 * 8 + lVar57 +
                                     (long)local_cb0 * -8 + lVar47);
                            dVar4 = *(double *)
                                     ((long)pdVar38 +
                                     lVar99 * 8 +
                                     (iVar90 - lVar53) * LVar20 * 8 + lVar80 * 8 + lVar57 +
                                     (long)local_cb0 * -8 + lVar47);
                            dVar124 = 0.0;
                            dVar117 = 0.0;
                            if ((lVar82 - lVar104 == lVar99) &&
                               (0 < piVar24[lVar88 + (int)(uVar68 + iVar1) + lVar63])) {
                              dVar117 = pdVar36[lVar89 + (lVar82 - lVar79) + lVar97 + lVar81];
                            }
                            if ((iVar91 == iVar13) &&
                               (0 < *(int *)((long)piVar22 +
                                            lVar99 * 4 +
                                            lVar93 * 4 + lVar50 * 4 + local_c70 * -4 + sVar16))) {
                              dVar124 = *(double *)
                                         ((long)pdVar35 +
                                         lVar99 * 8 +
                                         lVar49 * 8 + lVar84 * 8 + lVar51 + local_c78 * -8 + lVar47)
                              ;
                            }
                            dVar125 = 0.0;
                            dVar131 = 0.0;
                            if ((iVar45 == iVar12) &&
                               (0 < *(int *)((long)piVar21 +
                                            lVar99 * 4 +
                                            (long)local_c68 * 4 + (long)local_c58 * 4 + lVar54 * -4
                                            + sVar16))) {
                              dVar131 = *(double *)
                                         ((long)pdVar34 +
                                         (long)(local_d08 +
                                               lVar73 + lVar106 + ((lVar104 + lVar99) - local_c80)))
                              ;
                            }
                            if ((lVar61 - lVar104 == lVar99) &&
                               (0 < piVar19[lVar102 + iVar59 + lVar101])) {
                              dVar125 = local_c40[lVar85];
                            }
                            dVar126 = 0.0;
                            uVar111 = 0;
                            uVar112 = 0;
                            if ((iVar91 == iVar95) &&
                               (0 < *(int *)((long)piVar17 +
                                            lVar99 * 4 +
                                            lVar87 * 4 + lVar107 * 4 + local_d10 * -4 + sVar16))) {
                              uVar2 = *(undefined8 *)
                                       ((long)pdVar67 +
                                       lVar99 * 8 +
                                       lVar105 * 8 + lVar56 * 8 + lVar48 + local_c90 * -8 + lVar47);
                              uVar111 = (undefined4)uVar2;
                              uVar112 = (undefined4)((ulong)uVar2 >> 0x20);
                            }
                            if ((iVar45 == iVar11) &&
                               (0 < *(int *)((long)local_c48 +
                                            lVar99 * 4 +
                                            (long)((int)local_cd8 - local_a78.begin.z) *
                                            local_a78.kstride * 4 + (long)local_c60 * 4 +
                                            lVar55 * -4))) {
                              dVar126 = *(double *)
                                         ((long)pdVar32 +
                                         lVar99 * 8 +
                                         local_a38.nstride * local_fd0 +
                                         (lVar60 - local_a38.begin.y) * local_a38.jstride * 8 +
                                         (iVar11 - local_a38.begin.z) * local_a38.kstride * 8 +
                                         (long)local_a38.begin.x * -8 + lVar47);
                            }
                            dVar118 = *(double *)
                                       ((long)pdVar64 +
                                       lVar99 * 8 +
                                       lVar62 + lVar96 +
                                       ((int)local_d20 - local_d78.begin.y) * lVar65 + lVar103 * -8
                                       + lVar47);
                            dVar5 = *(double *)
                                     ((long)pdVar64 +
                                     lVar99 * 8 +
                                     (local_cc0 - local_d78.begin.y) * lVar65 + lVar62 + lVar96 +
                                     lVar103 * -8 + lVar47);
                            dVar6 = *(double *)
                                     ((long)pdVar64 +
                                     lVar99 * 8 +
                                     lVar83 + lVar96 + (iVar72 - local_d78.begin.z) * lVar75 +
                                     lVar103 * -8 + lVar47);
                            dVar129 = *(double *)
                                       ((long)pdVar64 +
                                       lVar99 * 8 +
                                       ((long)iVar90 - (long)local_d78.begin.z) * lVar75 + lVar83 +
                                       lVar96 + lVar103 * -8 + lVar47);
                            dVar130 = (dVar128 * dVar118 + dVar127 * dVar5) * dVar122 +
                                      (dVar3 * dVar6 + dVar4 * dVar129) * dVar115;
                            if ((iVar91 == iVar13) &&
                               (0 < *(int *)((long)piVar22 +
                                            lVar99 * 4 +
                                            (~local_b70.begin.y + iVar13) * local_b70.jstride * 4 +
                                            (lVar66 - local_b70.begin.z) * local_b70.kstride * 4 +
                                            (long)local_b70.begin.x * -4 + sVar16))) {
                              dVar130 = dVar130 - dVar122 * dVar128 * dVar118;
                            }
                            if ((iVar91 == iVar95) &&
                               (0 < *(int *)((long)piVar17 +
                                            lVar99 * 4 +
                                            ((iVar95 + 1) - local_c30.begin.y) * local_c30.jstride *
                                            4 + (lVar66 - local_c30.begin.z) * local_c30.kstride * 4
                                            + (long)local_c30.begin.x * -4 + sVar16))) {
                              dVar130 = dVar130 - dVar122 * dVar127 * dVar5;
                            }
                            if ((iVar45 == iVar12) &&
                               (0 < *(int *)((long)piVar21 +
                                            lVar99 * 4 +
                                            (~local_bb0.begin.z + iVar12) * local_bb0.kstride * 4 +
                                            (lVar60 - local_bb0.begin.y) * local_bb0.jstride * 4 +
                                            (long)local_bb0.begin.x * -4 + sVar16))) {
                              dVar130 = dVar130 - dVar115 * dVar3 * dVar6;
                            }
                            if ((iVar45 == iVar11) &&
                               (0 < *(int *)((long)local_c48 +
                                            lVar99 * 4 +
                                            local_a78.kstride * 4 *
                                            (long)((int)local_ce0 - local_a78.begin.z) +
                                            (lVar60 - local_a78.begin.y) * local_a78.jstride * 4 +
                                            (long)local_a78.begin.x * -4))) {
                              dVar130 = dVar130 - dVar115 * dVar4 * dVar129;
                            }
                            (&local_448[0].p)[lVar99] = (int *)(dVar113 * local_6b8._0_8_);
                            local_230[lVar99] =
                                 ((dVar3 + dVar4) * dVar115 +
                                 (dVar128 + dVar127) * dVar122 +
                                 dVar123 * local_c38 + (dVar113 + dVar116) * dVar119) -
                                 ((dVar3 * dVar131 + dVar4 * dVar126) * dVar115 +
                                 (dVar117 * dVar113 + dVar125 * dVar116) * dVar119 +
                                 (dVar128 * dVar124 + dVar127 * (double)CONCAT44(uVar112,uVar111)) *
                                 dVar122);
                            adStack_330[lVar99] = dVar116 * local_6b8._0_8_;
                            dVar130 = dVar130 + *(double *)
                                                 ((long)pdVar41 +
                                                 lVar99 * 8 +
                                                 local_838.nstride * local_fd0 +
                                                 (lVar66 - local_838.begin.z) * local_838.kstride *
                                                 8 + (lVar60 - local_838.begin.y) *
                                                     local_838.jstride * 8 +
                                                 (long)local_838.begin.x * -8 + lVar47);
                            local_548[lVar99] = dVar130;
                            if ((lVar99 == 0) &&
                               (local_448[0].p = (int *)0x0,
                               piVar24[(lVar60 - local_b30.begin.y) * local_b30.jstride +
                                       (long)(~local_b30.begin.x + iVar1) +
                                       local_ca0 * local_b30.kstride] < 1)) {
                              local_548[0] = dVar113 * dVar119 *
                                             pdVar64[(iVar91 - local_d78.begin.y) *
                                                     local_d78.jstride +
                                                     (iVar45 - local_d78.begin.z) *
                                                     local_d78.kstride +
                                                     local_d78.nstride * local_1008 +
                                                     (long)((int)local_d30 - local_d78.begin.x)] +
                                             dVar130;
                            }
                            if ((lVar100 - lVar104 == lVar99) &&
                               (adStack_330[lVar99] = 0.0,
                               piVar19[(lVar60 - local_bf0.begin.y) * local_bf0.jstride +
                                       (long)((iVar14 + 1) - local_bf0.begin.x) +
                                       (lVar66 - local_bf0.begin.z) * local_bf0.kstride] < 1)) {
                              local_548[lVar99] =
                                   dVar116 * dVar119 *
                                   *(double *)
                                    ((long)pdVar64 +
                                    lVar99 * 8 +
                                    lVar96 + (lVar58 * local_d78.kstride +
                                             lVar74 * local_d78.jstride + lVar104) * 8 +
                                    lVar103 * -8 + 8) + local_548[lVar99];
                            }
                            lVar99 = lVar99 + 1;
                          } while ((iVar27 - iVar15) + 1 != (int)lVar99);
                        }
                        local_648[0] = local_548[0] / local_230[0];
                        if (0 < (int)uVar10) {
                          lVar65 = 0;
                          dVar113 = local_230[0];
                          do {
                            dVar113 = *(double *)((long)adStack_330 + lVar65) / dVar113;
                            *(double *)((long)adStack_128 + lVar65) = dVar113;
                            dVar116 = *(double *)((long)&local_448[0].jstride + lVar65);
                            dVar113 = *(double *)((long)local_230 + lVar65 + 8) - dVar113 * dVar116;
                            if ((dVar113 == 0.0) && (!NAN(dVar113))) {
                              Abort_host(">>>TRIDIAG FAILED");
                            }
                            *(double *)((long)local_648 + lVar65 + 8) =
                                 (-dVar116 * *(double *)((long)local_648 + lVar65) +
                                 *(double *)((long)local_548 + lVar65 + 8)) / dVar113;
                            lVar65 = lVar65 + 8;
                          } while ((ulong)(uVar10 + 1) * 8 + -8 != lVar65);
                        }
                        lVar65 = local_7e8;
                        if (0 < (int)uVar10) {
                          dVar113 = local_648[local_d28];
                          lVar75 = local_cb8;
                          do {
                            dVar113 = local_648[lVar75 + -2] - dVar113 * adStack_128[lVar75 + -2];
                            local_648[lVar75 + -2] = dVar113;
                            lVar75 = lVar75 + -1;
                          } while (1 < lVar75);
                        }
                        if (iVar15 <= iVar27) {
                          memcpy((void *)((long)local_d78.p +
                                         local_d78.nstride * local_cc8 +
                                         (lVar66 - local_d78.begin.z) * local_d78.kstride * 8 +
                                         (lVar60 - local_d78.begin.y) * local_d78.jstride * 8 +
                                         (long)local_d78.begin.x * -8 + lVar47),local_648,__n);
                        }
                      }
                      iVar72 = iVar72 + 1;
                      bVar110 = iVar45 != (int)lVar65;
                      iVar45 = iVar45 + 1;
                    } while (bVar110);
                  }
                  local_d38 = CONCAT44(local_d38._4_4_,(int)local_d38 + 1);
                  local_d20 = CONCAT44(local_d20._4_4_,(int)local_d20 + 1);
                  bVar110 = iVar91 != iVar28;
                  iVar91 = iVar91 + 1;
                } while (bVar110);
              }
              local_1008 = local_1008 + 1;
              local_fd0 = local_fd0 + 8;
            } while (local_1008 != local_d00);
          }
        }
      }
      else {
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (local_448,
                   (FabArray<amrex::IArrayBox> *)
                   (&(pVVar8->
                     super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     ).
                     super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)[local_6f8][local_7f0]._M_t,
                   &local_6a8);
        if (0 < (int)uVar44) {
          lVar100 = (long)local_ad4.smallend.vect[0];
          lVar65 = lVar100 * 8;
          local_ee8 = 0;
          local_fc8 = 0;
          do {
            iVar12 = local_ad4.smallend.vect[2];
            iVar13 = local_ad4.smallend.vect[2] + local_ad4.smallend.vect[0] +
                     (int)local_cf8 + local_ad4.smallend.vect[1];
            iVar1 = local_ad4.smallend.vect[2] + -1;
            iVar14 = local_ad4.smallend.vect[2];
            if (local_ad4.smallend.vect[2] <= local_ad4.bigend.vect[2]) {
              do {
                iVar14 = iVar14 + 1;
                if (local_ad4.smallend.vect[1] <= local_ad4.bigend.vect[1]) {
                  lVar47 = (long)iVar12;
                  iVar11 = local_ad4.smallend.vect[1];
                  iVar70 = iVar13;
                  iVar95 = local_ad4.smallend.vect[1] + -1;
                  iVar15 = local_ad4.smallend.vect[1];
                  do {
                    iVar15 = iVar15 + 1;
                    if (local_ad4.smallend.vect[0] <= local_ad4.bigend.vect[0]) {
                      lVar101 = (long)iVar11;
                      lVar82 = local_878.nstride * local_ee8 +
                               (lVar101 - local_878.begin.y) * local_878.jstride * 8 +
                               (lVar47 - local_878.begin.z) * local_878.kstride * 8 +
                               (long)local_878.begin.x * -8 + lVar65;
                      lVar78 = (lVar47 - local_ab8.begin.z) * local_ab8.kstride;
                      lVar81 = (lVar101 - local_8b8.begin.y) * local_8b8.jstride;
                      lVar75 = local_d78.jstride * 8;
                      lVar79 = (lVar101 - local_d78.begin.y) * lVar75;
                      lVar66 = local_d78.kstride * 8;
                      lVar60 = (lVar47 - local_d78.begin.z) * lVar66;
                      lVar105 = local_d78.nstride * local_ee8;
                      lVar61 = (long)local_d78.begin.x;
                      lVar104 = lVar60 + lVar79 + lVar105 + lVar61 * -8 + lVar65;
                      lVar106 = 0;
                      do {
                        if (((int)lVar106 + iVar70 & 1U) == 0) {
                          if (local_448[0].p
                              [lVar100 + (((lVar47 - local_448[0].begin.z) * local_448[0].kstride +
                                          (lVar101 - local_448[0].begin.y) * local_448[0].jstride +
                                          lVar106) - (long)local_448[0].begin.x)] == 0) {
                            *(undefined8 *)((long)local_d78.p + lVar106 * 8 + lVar104) = 0;
                          }
                          else {
                            uVar111 = 0;
                            uVar112 = 0;
                            dVar113 = 0.0;
                            if (((long)local_af0.smallend.vect[0] + -lVar100 == lVar106) &&
                               (0 < local_b30.p
                                    [(lVar101 - local_b30.begin.y) * local_b30.jstride +
                                     (long)(~local_b30.begin.x + local_af0.smallend.vect[0]) +
                                     (lVar47 - local_b30.begin.z) * local_b30.kstride])) {
                              dVar113 = local_8f8.p
                                        [(lVar101 - local_8f8.begin.y) * local_8f8.jstride +
                                         ((long)local_af0.smallend.vect[0] - (long)local_8f8.begin.x
                                         ) + (lVar47 - local_8f8.begin.z) * local_8f8.kstride +
                                             local_8f8.nstride * local_fc8];
                            }
                            if ((local_af0.smallend.vect[1] == iVar11) &&
                               (0 < local_b70.p
                                    [lVar100 + (((lVar47 - local_b70.begin.z) * local_b70.kstride +
                                                (~local_b70.begin.y + local_af0.smallend.vect[1]) *
                                                local_b70.jstride + lVar106) -
                                               (long)local_b70.begin.x)])) {
                              uVar2 = *(undefined8 *)
                                       ((long)local_938.p +
                                       lVar106 * 8 +
                                       local_938.nstride * local_ee8 +
                                       (lVar47 - local_938.begin.z) * local_938.kstride * 8 +
                                       (local_af0.smallend.vect[1] - local_938.begin.y) *
                                       local_938.jstride * 8 + (long)local_938.begin.x * -8 + lVar65
                                       );
                              uVar111 = (undefined4)uVar2;
                              uVar112 = (undefined4)((ulong)uVar2 >> 0x20);
                            }
                            dVar123 = 0.0;
                            dVar116 = 0.0;
                            if ((local_af0.smallend.vect[2] == iVar12) &&
                               (0 < local_bb0.p
                                    [lVar100 + (((lVar101 - local_bb0.begin.y) * local_bb0.jstride +
                                                (~local_bb0.begin.z + local_af0.smallend.vect[2]) *
                                                local_bb0.kstride + lVar106) -
                                               (long)local_bb0.begin.x)])) {
                              dVar116 = *(double *)
                                         ((long)local_978.p +
                                         lVar106 * 8 +
                                         local_978.nstride * local_ee8 +
                                         (lVar101 - local_978.begin.y) * local_978.jstride * 8 +
                                         (local_af0.smallend.vect[2] - local_978.begin.z) *
                                         local_978.kstride * 8 + (long)local_978.begin.x * -8 +
                                         lVar65);
                            }
                            if (((long)local_af0.bigend.vect[0] + -lVar100 == lVar106) &&
                               (0 < local_bf0.p
                                    [(lVar101 - local_bf0.begin.y) * local_bf0.jstride +
                                     (long)((local_af0.bigend.vect[0] - local_bf0.begin.x) + 1) +
                                     (lVar47 - local_bf0.begin.z) * local_bf0.kstride])) {
                              dVar123 = local_9b8.p
                                        [(lVar101 - local_9b8.begin.y) * local_9b8.jstride +
                                         ((long)local_af0.bigend.vect[0] - (long)local_9b8.begin.x)
                                         + (lVar47 - local_9b8.begin.z) * local_9b8.kstride +
                                           local_9b8.nstride * local_fc8];
                            }
                            dVar127 = 0.0;
                            dVar128 = 0.0;
                            if ((local_af0.bigend.vect[1] == iVar11) &&
                               (0 < local_c30.p
                                    [lVar100 + (((lVar47 - local_c30.begin.z) * local_c30.kstride +
                                                ((local_af0.bigend.vect[1] - local_c30.begin.y) + 1)
                                                * local_c30.jstride + lVar106) -
                                               (long)local_c30.begin.x)])) {
                              dVar128 = *(double *)
                                         ((long)local_9f8.p +
                                         lVar106 * 8 +
                                         local_9f8.nstride * local_ee8 +
                                         (lVar47 - local_9f8.begin.z) * local_9f8.kstride * 8 +
                                         (local_af0.bigend.vect[1] - local_9f8.begin.y) *
                                         local_9f8.jstride * 8 + (long)local_9f8.begin.x * -8 +
                                         lVar65);
                            }
                            if ((local_af0.bigend.vect[2] == iVar12) &&
                               (0 < local_a78.p
                                    [lVar100 + (((lVar101 - local_a78.begin.y) * local_a78.jstride +
                                                ((local_af0.bigend.vect[2] - local_a78.begin.z) + 1)
                                                * local_a78.kstride + lVar106) -
                                               (long)local_a78.begin.x)])) {
                              dVar127 = *(double *)
                                         ((long)local_a38.p +
                                         lVar106 * 8 +
                                         local_a38.nstride * local_ee8 +
                                         (lVar101 - local_a38.begin.y) * local_a38.jstride * 8 +
                                         (local_af0.bigend.vect[2] - local_a38.begin.z) *
                                         local_a38.kstride * 8 + (long)local_a38.begin.x * -8 +
                                         lVar65);
                            }
                            dVar3 = *(double *)((long)local_878.p + lVar106 * 8 + lVar82);
                            dVar4 = *(double *)((long)local_878.p + lVar106 * 8 + lVar82 + 8);
                            dVar117 = *(double *)
                                       ((long)local_ab8.p +
                                       lVar106 * 8 +
                                       (lVar101 - local_ab8.begin.y) * local_ab8.jstride * 8 +
                                       lVar78 * 8 + local_ab8.nstride * local_ee8 +
                                       (long)local_ab8.begin.x * -8 + lVar65);
                            dVar124 = *(double *)
                                       ((long)local_ab8.p +
                                       lVar106 * 8 +
                                       ((long)iVar15 - (long)local_ab8.begin.y) *
                                       local_ab8.jstride * 8 + lVar78 * 8 +
                                       local_ab8.nstride * local_ee8 + (long)local_ab8.begin.x * -8
                                       + lVar65);
                            dVar131 = *(double *)
                                       ((long)local_8b8.p +
                                       lVar106 * 8 +
                                       (lVar47 - local_8b8.begin.z) * local_8b8.kstride * 8 +
                                       lVar81 * 8 + local_8b8.nstride * local_ee8 +
                                       (long)local_8b8.begin.x * -8 + lVar65);
                            dVar125 = *(double *)
                                       ((long)local_8b8.p +
                                       lVar106 * 8 +
                                       ((long)iVar14 - (long)local_8b8.begin.z) *
                                       local_8b8.kstride * 8 + lVar81 * 8 +
                                       local_8b8.nstride * local_ee8 + (long)local_8b8.begin.x * -8
                                       + lVar65);
                            dVar118 = (dVar131 + dVar125) * dStack_6e0 +
                                      (dVar117 + dVar124) * dVar122 +
                                      local_7c8.p
                                      [lVar100 + (((lVar47 - local_7c8.begin.z) * local_7c8.kstride
                                                  + (lVar101 - local_7c8.begin.y) *
                                                    local_7c8.jstride + lVar106) -
                                                 (long)local_7c8.begin.x)] * local_c38 +
                                      (dVar3 + dVar4) * dVar119;
                            dVar126 = *(double *)((long)local_d78.p + lVar106 * 8 + lVar104);
                            *(double *)((long)local_d78.p + lVar106 * 8 + lVar104) =
                                 (1.15 / (dVar118 -
                                         ((dVar116 * dVar131 + dVar127 * dVar125) * local_6e8 +
                                         (dVar113 * dVar3 + dVar123 * dVar4) * dVar119 +
                                         ((double)CONCAT44(uVar112,uVar111) * dVar117 +
                                         dVar128 * dVar124) * dVar122))) *
                                 (*(double *)
                                   ((long)local_838.p +
                                   lVar106 * 8 +
                                   local_838.nstride * local_ee8 +
                                   (lVar101 - local_838.begin.y) * local_838.jstride * 8 +
                                   (lVar47 - local_838.begin.z) * local_838.kstride * 8 +
                                   (long)local_838.begin.x * -8 + lVar65) -
                                 (dVar118 * dVar126 -
                                 ((dVar131 * *(double *)
                                              ((long)local_d78.p +
                                              lVar106 * 8 +
                                              lVar105 + lVar79 +
                                              (iVar1 - local_d78.begin.z) * lVar66 + lVar61 * -8 +
                                              lVar65) +
                                  dVar125 * *(double *)
                                             ((long)local_d78.p +
                                             lVar106 * 8 +
                                             ((long)iVar14 - (long)local_d78.begin.z) * lVar66 +
                                             lVar79 + lVar105 + lVar61 * -8 + lVar65)) * dVar115 +
                                 (dVar3 * local_d78.p
                                          [(iVar11 - local_d78.begin.y) * local_d78.jstride +
                                           (iVar12 - local_d78.begin.z) * local_d78.kstride +
                                           local_d78.nstride * local_fc8 +
                                           (long)(((local_ad4.smallend.vect[0] + -1) -
                                                  local_d78.begin.x) + (int)lVar106)] +
                                 dVar4 * *(double *)((long)local_d78.p + lVar106 * 8 + lVar104 + 8))
                                 * dVar119 +
                                 (dVar117 * *(double *)
                                             ((long)local_d78.p +
                                             lVar106 * 8 +
                                             lVar60 + lVar105 +
                                             (iVar95 - local_d78.begin.y) * lVar75 + lVar61 * -8 +
                                             lVar65) +
                                 dVar124 * *(double *)
                                            ((long)local_d78.p +
                                            lVar106 * 8 +
                                            ((long)iVar15 - (long)local_d78.begin.y) * lVar75 +
                                            lVar60 + lVar105 + lVar61 * -8 + lVar65)) * dVar122))) +
                                 dVar126;
                          }
                        }
                        lVar106 = lVar106 + 1;
                      } while ((local_ad4.bigend.vect[0] - local_ad4.smallend.vect[0]) + 1 !=
                               (int)lVar106);
                    }
                    iVar95 = iVar95 + 1;
                    iVar70 = iVar70 + 1;
                    bVar110 = iVar11 != local_ad4.bigend.vect[1];
                    iVar11 = iVar11 + 1;
                  } while (bVar110);
                }
                iVar1 = iVar1 + 1;
                iVar13 = iVar13 + 1;
                bVar110 = iVar12 != local_ad4.bigend.vect[2];
                iVar12 = iVar12 + 1;
              } while (bVar110);
            }
            local_fc8 = local_fc8 + 1;
            local_ee8 = local_ee8 + 8;
          } while (local_fc8 != local_d00);
        }
      }
      MFIter::operator++(&local_6a8);
    } while (local_6a8.currentIndex < local_6a8.endIndex);
  }
  MFIter::~MFIter(&local_6a8);
  return;
}

Assistant:

void
MLABecLaplacian::Fsmooth (int amrlev, int mglev, MultiFab& sol, const MultiFab& rhs, int redblack) const
{
    BL_PROFILE("MLABecLaplacian::Fsmooth()");

    bool regular_coarsening = true;
    if (amrlev == 0 && mglev > 0) {
        regular_coarsening = mg_coarsen_ratio_vec[mglev-1] == mg_coarsen_ratio;
    }

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_ALWAYS_ASSERT(acoef.nGrowVect() == 0);
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);
    const auto& undrrelxr = m_undrrelxr[amrlev][mglev];
    const auto& maskvals  = m_maskvals [amrlev][mglev];

    OrientationIter oitr;

    const FabSet& f0 = undrrelxr[oitr()]; ++oitr;
    const FabSet& f1 = undrrelxr[oitr()]; ++oitr;
#if (AMREX_SPACEDIM > 1)
    const FabSet& f2 = undrrelxr[oitr()]; ++oitr;
    const FabSet& f3 = undrrelxr[oitr()]; ++oitr;
#if (AMREX_SPACEDIM > 2)
    const FabSet& f4 = undrrelxr[oitr()]; ++oitr;
    const FabSet& f5 = undrrelxr[oitr()]; ++oitr;
#endif
#endif

    const MultiMask& mm0 = maskvals[0];
    const MultiMask& mm1 = maskvals[1];
#if (AMREX_SPACEDIM > 1)
    const MultiMask& mm2 = maskvals[2];
    const MultiMask& mm3 = maskvals[3];
#if (AMREX_SPACEDIM > 2)
    const MultiMask& mm4 = maskvals[4];
    const MultiMask& mm5 = maskvals[5];
#endif
#endif

    const int nc = getNComp();
    const Real* h = m_geom[amrlev][mglev].CellSize();
    AMREX_D_TERM(const Real dhx = m_b_scalar/(h[0]*h[0]);,
                 const Real dhy = m_b_scalar/(h[1]*h[1]);,
                 const Real dhz = m_b_scalar/(h[2]*h[2]));
    const Real alpha = m_a_scalar;

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && sol.isFusingCandidate()
        && (m_overset_mask[amrlev][mglev] || regular_coarsening))
    {
        const auto& m0ma = mm0.const_arrays();
        const auto& m1ma = mm1.const_arrays();
#if (AMREX_SPACEDIM > 1)
        const auto& m2ma = mm2.const_arrays();
        const auto& m3ma = mm3.const_arrays();
#if (AMREX_SPACEDIM > 2)
        const auto& m4ma = mm4.const_arrays();
        const auto& m5ma = mm5.const_arrays();
#endif
#endif

        const auto& solnma = sol.arrays();
        const auto& rhsma = rhs.const_arrays();
        const auto& ama = acoef.const_arrays();

        AMREX_D_TERM(const auto& bxma = bxcoef.const_arrays();,
                     const auto& byma = bycoef.const_arrays();,
                     const auto& bzma = bzcoef.const_arrays(););

        const auto& f0ma = f0.const_arrays();
        const auto& f1ma = f1.const_arrays();
#if (AMREX_SPACEDIM > 1)
        const auto& f2ma = f2.const_arrays();
        const auto& f3ma = f3.const_arrays();
#if (AMREX_SPACEDIM > 2)
        const auto& f4ma = f4.const_arrays();
        const auto& f5ma = f5.const_arrays();
#endif
#endif

        if (m_overset_mask[amrlev][mglev]) {
            const auto& osmma = m_overset_mask[amrlev][mglev]->const_arrays();
            ParallelFor(sol, IntVect(0), nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                Box vbx(ama[box_no]);
                abec_gsrb_os(i,j,k,n, solnma[box_no], rhsma[box_no], alpha, ama[box_no],
                             AMREX_D_DECL(dhx, dhy, dhz),
                             AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                             AMREX_D_DECL(m0ma[box_no],m2ma[box_no],m4ma[box_no]),
                             AMREX_D_DECL(m1ma[box_no],m3ma[box_no],m5ma[box_no]),
                             AMREX_D_DECL(f0ma[box_no],f2ma[box_no],f4ma[box_no]),
                             AMREX_D_DECL(f1ma[box_no],f3ma[box_no],f5ma[box_no]),
                             osmma[box_no], vbx, redblack);
            });
        } else if (regular_coarsening) {
            ParallelFor(sol, IntVect(0), nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                Box vbx(ama[box_no]);
                abec_gsrb(i,j,k,n, solnma[box_no], rhsma[box_no], alpha, ama[box_no],
                          AMREX_D_DECL(dhx, dhy, dhz),
                          AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                          AMREX_D_DECL(m0ma[box_no],m2ma[box_no],m4ma[box_no]),
                          AMREX_D_DECL(m1ma[box_no],m3ma[box_no],m5ma[box_no]),
                          AMREX_D_DECL(f0ma[box_no],f2ma[box_no],f4ma[box_no]),
                          AMREX_D_DECL(f1ma[box_no],f3ma[box_no],f5ma[box_no]),
                          vbx, redblack);
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(sol,mfi_info); mfi.isValid(); ++mfi)
        {
            const auto& m0 = mm0.array(mfi);
            const auto& m1 = mm1.array(mfi);
#if (AMREX_SPACEDIM > 1)
            const auto& m2 = mm2.array(mfi);
            const auto& m3 = mm3.array(mfi);
#if (AMREX_SPACEDIM > 2)
            const auto& m4 = mm4.array(mfi);
            const auto& m5 = mm5.array(mfi);
#endif
#endif

            const Box& tbx = mfi.tilebox();
            const Box& vbx = mfi.validbox();
            const auto& solnfab = sol.array(mfi);
            const auto& rhsfab  = rhs.const_array(mfi);
            const auto& afab    = acoef.const_array(mfi);

            AMREX_D_TERM(const auto& bxfab = bxcoef.const_array(mfi);,
                         const auto& byfab = bycoef.const_array(mfi);,
                         const auto& bzfab = bzcoef.const_array(mfi););

            const auto& f0fab = f0.const_array(mfi);
            const auto& f1fab = f1.const_array(mfi);
#if (AMREX_SPACEDIM > 1)
            const auto& f2fab = f2.const_array(mfi);
            const auto& f3fab = f3.const_array(mfi);
#if (AMREX_SPACEDIM > 2)
            const auto& f4fab = f4.const_array(mfi);
            const auto& f5fab = f5.const_array(mfi);
#endif
#endif

            if (m_overset_mask[amrlev][mglev]) {
                const auto& osm = m_overset_mask[amrlev][mglev]->const_array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(tbx, nc, i, j, k, n,
                {
                    abec_gsrb_os(i,j,k,n, solnfab, rhsfab, alpha, afab,
                                 AMREX_D_DECL(dhx, dhy, dhz),
                                 AMREX_D_DECL(bxfab, byfab, bzfab),
                                 AMREX_D_DECL(m0,m2,m4),
                                 AMREX_D_DECL(m1,m3,m5),
                                 AMREX_D_DECL(f0fab,f2fab,f4fab),
                                 AMREX_D_DECL(f1fab,f3fab,f5fab),
                                 osm, vbx, redblack);
                });
            } else if (regular_coarsening) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(tbx, nc, i, j, k, n,
                {
                    abec_gsrb(i,j,k,n, solnfab, rhsfab, alpha, afab,
                              AMREX_D_DECL(dhx, dhy, dhz),
                              AMREX_D_DECL(bxfab, byfab, bzfab),
                              AMREX_D_DECL(m0,m2,m4),
                              AMREX_D_DECL(m1,m3,m5),
                              AMREX_D_DECL(f0fab,f2fab,f4fab),
                              AMREX_D_DECL(f1fab,f3fab,f5fab),
                              vbx, redblack);
                });
            } else {
                Gpu::LaunchSafeGuard lsg(false); // xxxxx gpu todo
                // line solve does not with with GPU
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( tbx, thread_box,
                {
                    abec_gsrb_with_line_solve(thread_box, solnfab, rhsfab, alpha, afab,
                                              AMREX_D_DECL(dhx, dhy, dhz),
                                              AMREX_D_DECL(bxfab, byfab, bzfab),
                                              AMREX_D_DECL(m0,m2,m4),
                                              AMREX_D_DECL(m1,m3,m5),
                                              AMREX_D_DECL(f0fab,f2fab,f4fab),
                                              AMREX_D_DECL(f1fab,f3fab,f5fab),
                                              vbx, redblack, nc);
                });
            }
        }
    }
}